

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_hn<embree::sse2::OrientedCurve1Intersector1<embree::HermiteCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  Primitive PVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  __int_type_conflict _Var24;
  long lVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined3 uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  unkbyte9 Var69;
  undefined1 auVar70 [11];
  undefined1 auVar71 [13];
  undefined1 auVar72 [12];
  undefined1 auVar73 [13];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined6 uVar80;
  undefined1 auVar81 [12];
  undefined1 auVar82 [12];
  undefined1 auVar83 [12];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [15];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [13];
  undefined1 auVar101 [15];
  byte bVar102;
  ulong uVar103;
  ulong uVar104;
  ulong uVar105;
  RTCFilterFunctionN p_Var106;
  long lVar107;
  undefined4 uVar108;
  undefined8 unaff_RBP;
  long lVar110;
  byte bVar111;
  bool bVar112;
  uint uVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  float fVar117;
  undefined2 uVar144;
  float fVar146;
  undefined1 auVar118 [12];
  float fVar145;
  vfloat_impl<4> p00;
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  short sVar147;
  int iVar148;
  undefined1 auVar150 [12];
  int iVar183;
  undefined1 in_XMM1 [16];
  undefined1 auVar152 [16];
  char cVar186;
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar151 [12];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar182 [16];
  char cVar187;
  float fVar188;
  char cVar212;
  undefined2 uVar213;
  float fVar214;
  float fVar216;
  vfloat4 a_1;
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined2 uVar215;
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  char cVar226;
  float fVar217;
  float fVar218;
  float fVar227;
  float fVar229;
  undefined1 auVar221 [16];
  float fVar228;
  float fVar230;
  float fVar231;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar232 [12];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar253;
  float fVar264;
  float fVar265;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  float fVar267;
  undefined1 auVar266 [16];
  undefined1 auVar268 [12];
  float fVar287;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar269 [12];
  undefined1 auVar275 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 uVar302;
  float fVar303;
  float fVar309;
  undefined1 auVar291 [16];
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar320;
  float fVar336;
  float fVar339;
  undefined1 auVar323 [12];
  undefined1 auVar324 [16];
  float fVar321;
  float fVar322;
  undefined1 auVar328 [16];
  float fVar337;
  float fVar338;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar344;
  float fVar345;
  float fVar352;
  float fVar355;
  vfloat4 a;
  undefined1 auVar346 [16];
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar368;
  float fVar371;
  vfloat4 a_2;
  undefined1 auVar362 [16];
  float fVar369;
  float fVar370;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar376;
  float fVar377;
  float fVar385;
  float fVar387;
  undefined1 auVar378 [16];
  undefined1 auVar381 [16];
  float fVar386;
  float fVar388;
  float fVar389;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  float fVar390;
  float fVar391;
  float fVar399;
  float fVar401;
  undefined1 auVar392 [16];
  float fVar400;
  float fVar402;
  float fVar403;
  float fVar404;
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  float fVar405;
  float fVar411;
  float fVar412;
  float fVar413;
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  float fVar414;
  float fVar420;
  float fVar421;
  undefined1 auVar415 [16];
  float fVar422;
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined4 local_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  Primitive *local_290;
  RTCFilterFunctionNArguments local_288;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint auStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  undefined4 local_1e4;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  ulong uVar109;
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar149 [12];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  int iVar184;
  int iVar185;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar219 [12];
  undefined1 auVar222 [16];
  undefined1 auVar220 [16];
  undefined1 auVar223 [16];
  undefined1 auVar235 [16];
  undefined1 auVar239 [16];
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [16];
  undefined1 auVar273 [16];
  undefined1 auVar277 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  
  PVar11 = prim[1];
  uVar103 = (ulong)(byte)PVar11;
  lVar110 = uVar103 * 0x25;
  uVar108 = *(undefined4 *)(prim + uVar103 * 4 + 6);
  uVar12 = *(undefined4 *)(prim + uVar103 * 5 + 6);
  uVar13 = *(undefined4 *)(prim + uVar103 * 6 + 6);
  uVar14 = *(undefined4 *)(prim + uVar103 * 0xf + 6);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  uVar16 = *(undefined4 *)(prim + uVar103 * 0x11 + 6);
  uVar17 = *(undefined4 *)(prim + uVar103 * 0x1a + 6);
  uVar18 = *(undefined4 *)(prim + uVar103 * 0x1b + 6);
  pPVar4 = prim + lVar110 + 6;
  fVar371 = *(float *)(pPVar4 + 0xc);
  fVar117 = ((ray->org).field_0.m128[0] - *(float *)pPVar4) * fVar371;
  fVar145 = ((ray->org).field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar371;
  fVar146 = ((ray->org).field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar371;
  fVar359 = fVar371 * (ray->dir).field_0.m128[0];
  fVar368 = fVar371 * (ray->dir).field_0.m128[1];
  fVar371 = fVar371 * (ray->dir).field_0.m128[2];
  uVar19 = *(undefined4 *)(prim + uVar103 * 0x1c + 6);
  auVar38[0xd] = 0;
  auVar38._0_13_ = in_XMM1._0_13_;
  auVar38[0xe] = in_XMM1[7];
  auVar42[0xc] = in_XMM1[6];
  auVar42._0_12_ = in_XMM1._0_12_;
  auVar42._13_2_ = auVar38._13_2_;
  auVar46[0xb] = 0;
  auVar46._0_11_ = in_XMM1._0_11_;
  auVar46._12_3_ = auVar42._12_3_;
  auVar50[10] = in_XMM1[5];
  auVar50._0_10_ = in_XMM1._0_10_;
  auVar50._11_4_ = auVar46._11_4_;
  auVar54[9] = 0;
  auVar54._0_9_ = in_XMM1._0_9_;
  auVar54._10_5_ = auVar50._10_5_;
  auVar58[8] = in_XMM1[4];
  auVar58._0_8_ = in_XMM1._0_8_;
  auVar58._9_6_ = auVar54._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar12 >> 0x18)),in_XMM1[3]);
  auVar70._2_9_ = Var69;
  auVar70[1] = (char)((uint)uVar12 >> 0x10);
  auVar70[0] = in_XMM1[2];
  cVar212 = (char)((uint)uVar12 >> 8);
  auVar71._2_11_ = auVar70;
  auVar71[1] = cVar212;
  auVar71[0] = in_XMM1[1];
  cVar187 = (char)uVar12;
  sVar147 = CONCAT11(cVar187,in_XMM1[0]);
  auVar65._2_13_ = auVar71;
  auVar65._0_2_ = sVar147;
  uVar144 = (undefined2)Var69;
  auVar154._0_12_ = auVar65._0_12_;
  auVar154._12_2_ = uVar144;
  auVar154._14_2_ = uVar144;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_10_ = auVar65._0_10_;
  auVar153._10_2_ = auVar70._0_2_;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._0_8_ = auVar65._0_8_;
  auVar152._8_2_ = auVar70._0_2_;
  auVar72._4_8_ = auVar152._8_8_;
  auVar72._2_2_ = auVar71._0_2_;
  auVar72._0_2_ = auVar71._0_2_;
  iVar148 = (int)sVar147 >> 8;
  iVar183 = auVar72._0_4_ >> 0x18;
  auVar149._0_8_ = CONCAT44(iVar183,iVar148);
  auVar149._8_4_ = auVar152._8_4_ >> 0x18;
  auVar155._12_4_ = auVar153._12_4_ >> 0x18;
  auVar155._0_12_ = auVar149;
  fVar267 = (float)iVar183;
  cVar186 = cVar212 >> 7;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar155._0_13_;
  auVar39[0xe] = cVar186;
  auVar43[0xc] = cVar186;
  auVar43._0_12_ = auVar149;
  auVar43._13_2_ = auVar39._13_2_;
  auVar47[0xb] = 0;
  auVar47._0_11_ = auVar149._0_11_;
  auVar47._12_3_ = auVar43._12_3_;
  auVar51[10] = cVar186;
  auVar51._0_10_ = auVar149._0_10_;
  auVar51._11_4_ = auVar47._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar149._0_9_;
  auVar55._10_5_ = auVar51._10_5_;
  auVar59[8] = cVar212;
  auVar59._0_8_ = auVar149._0_8_;
  auVar59._9_6_ = auVar55._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar59._8_7_,(char)((uint)uVar13 >> 0x18)),(short)cVar187 >> 7);
  auVar62._6_9_ = Var69;
  auVar62[5] = (char)((uint)uVar13 >> 0x10);
  auVar62[4] = (undefined1)((short)cVar187 >> 7);
  auVar62._0_4_ = iVar148;
  cVar226 = (char)((uint)uVar13 >> 8);
  auVar73._2_11_ = auVar62._4_11_;
  auVar73[1] = cVar226;
  auVar73[0] = (undefined1)((short)cVar187 >> 7);
  cVar212 = (char)uVar13;
  auVar66._2_13_ = auVar73;
  auVar66._0_2_ = CONCAT11(cVar212,cVar187);
  uVar144 = (undefined2)Var69;
  auVar158._0_12_ = auVar66._0_12_;
  auVar158._12_2_ = uVar144;
  auVar158._14_2_ = uVar144;
  auVar157._12_4_ = auVar158._12_4_;
  auVar157._0_10_ = auVar66._0_10_;
  auVar157._10_2_ = auVar62._4_2_;
  auVar156._10_6_ = auVar157._10_6_;
  auVar156._0_8_ = auVar66._0_8_;
  auVar156._8_2_ = auVar62._4_2_;
  auVar74._4_8_ = auVar156._8_8_;
  auVar74._2_2_ = auVar73._0_2_;
  auVar74._0_2_ = auVar73._0_2_;
  iVar183 = (int)CONCAT11(cVar212,cVar187) >> 8;
  iVar184 = auVar74._0_4_ >> 0x18;
  auVar150._0_8_ = CONCAT44(iVar184,iVar183);
  auVar150._8_4_ = auVar156._8_4_ >> 0x18;
  auVar159._12_4_ = auVar157._12_4_ >> 0x18;
  auVar159._0_12_ = auVar150;
  fVar352 = (float)iVar184;
  cVar186 = cVar226 >> 7;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar159._0_13_;
  auVar40[0xe] = cVar186;
  auVar44[0xc] = cVar186;
  auVar44._0_12_ = auVar150;
  auVar44._13_2_ = auVar40._13_2_;
  auVar48[0xb] = 0;
  auVar48._0_11_ = auVar150._0_11_;
  auVar48._12_3_ = auVar44._12_3_;
  auVar52[10] = cVar186;
  auVar52._0_10_ = auVar150._0_10_;
  auVar52._11_4_ = auVar48._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar150._0_9_;
  auVar56._10_5_ = auVar52._10_5_;
  auVar60[8] = cVar226;
  auVar60._0_8_ = auVar150._0_8_;
  auVar60._9_6_ = auVar56._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar60._8_7_,(char)((uint)uVar15 >> 0x18)),(short)cVar212 >> 7);
  auVar63._6_9_ = Var69;
  auVar63[5] = (char)((uint)uVar15 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar212 >> 7);
  auVar63._0_4_ = iVar183;
  cVar226 = (char)((uint)uVar15 >> 8);
  auVar75._2_11_ = auVar63._4_11_;
  auVar75[1] = cVar226;
  auVar75[0] = (undefined1)((short)cVar212 >> 7);
  cVar187 = (char)uVar15;
  auVar67._2_13_ = auVar75;
  auVar67._0_2_ = CONCAT11(cVar187,cVar212);
  uVar144 = (undefined2)Var69;
  auVar162._0_12_ = auVar67._0_12_;
  auVar162._12_2_ = uVar144;
  auVar162._14_2_ = uVar144;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar67._0_10_;
  auVar161._10_2_ = auVar63._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar67._0_8_;
  auVar160._8_2_ = auVar63._4_2_;
  auVar76._4_8_ = auVar160._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar184 = (int)CONCAT11(cVar187,cVar212) >> 8;
  iVar185 = auVar76._0_4_ >> 0x18;
  auVar151._0_8_ = CONCAT44(iVar185,iVar184);
  auVar151._8_4_ = auVar160._8_4_ >> 0x18;
  auVar163._12_4_ = auVar161._12_4_ >> 0x18;
  auVar163._0_12_ = auVar151;
  fVar287 = (float)iVar185;
  cVar186 = cVar226 >> 7;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar163._0_13_;
  auVar41[0xe] = cVar186;
  auVar45[0xc] = cVar186;
  auVar45._0_12_ = auVar151;
  auVar45._13_2_ = auVar41._13_2_;
  auVar49[0xb] = 0;
  auVar49._0_11_ = auVar151._0_11_;
  auVar49._12_3_ = auVar45._12_3_;
  auVar53[10] = cVar186;
  auVar53._0_10_ = auVar151._0_10_;
  auVar53._11_4_ = auVar49._11_4_;
  auVar57[9] = 0;
  auVar57._0_9_ = auVar151._0_9_;
  auVar57._10_5_ = auVar53._10_5_;
  auVar61[8] = cVar226;
  auVar61._0_8_ = auVar151._0_8_;
  auVar61._9_6_ = auVar57._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar61._8_7_,(char)((uint)uVar16 >> 0x18)),(short)cVar187 >> 7);
  auVar64._6_9_ = Var69;
  auVar64[5] = (char)((uint)uVar16 >> 0x10);
  auVar64[4] = (undefined1)((short)cVar187 >> 7);
  auVar64._0_4_ = iVar184;
  auVar77._2_11_ = auVar64._4_11_;
  auVar77[1] = (char)((uint)uVar16 >> 8);
  auVar77[0] = (undefined1)((short)cVar187 >> 7);
  sVar147 = CONCAT11((char)uVar16,cVar187);
  auVar68._2_13_ = auVar77;
  auVar68._0_2_ = sVar147;
  uVar144 = (undefined2)Var69;
  auVar166._0_12_ = auVar68._0_12_;
  auVar166._12_2_ = uVar144;
  auVar166._14_2_ = uVar144;
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._0_10_ = auVar68._0_10_;
  auVar165._10_2_ = auVar64._4_2_;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._0_8_ = auVar68._0_8_;
  auVar164._8_2_ = auVar64._4_2_;
  auVar78._4_8_ = auVar164._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  fVar320 = (float)((int)sVar147 >> 8);
  fVar336 = (float)(auVar78._0_4_ >> 0x18);
  fVar339 = (float)(auVar164._8_4_ >> 0x18);
  fVar217 = fVar371 * fVar320;
  fVar227 = fVar371 * fVar336;
  auVar219._0_8_ = CONCAT44(fVar227,fVar217);
  auVar219._8_4_ = fVar371 * fVar339;
  auVar220._12_4_ = fVar371 * (float)(auVar165._12_4_ >> 0x18);
  auVar220._0_12_ = auVar219;
  fVar188 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar110 + 0x16)) *
            *(float *)(prim + lVar110 + 0x1a);
  local_418[0] = (undefined1)uVar108;
  local_418[1] = (undefined1)((uint)uVar108 >> 8);
  local_418[2] = (undefined1)((uint)uVar108 >> 0x10);
  local_418[3] = (undefined1)((uint)uVar108 >> 0x18);
  auVar91[0xd] = 0;
  auVar91._0_13_ = auVar220._0_13_;
  auVar91[0xe] = (char)((uint)fVar227 >> 0x18);
  auVar94[0xc] = (char)((uint)fVar227 >> 0x10);
  auVar94._0_12_ = auVar219;
  auVar94._13_2_ = auVar91._13_2_;
  auVar95[0xb] = 0;
  auVar95._0_11_ = auVar219._0_11_;
  auVar95._12_3_ = auVar94._12_3_;
  auVar96[10] = (char)((uint)fVar227 >> 8);
  auVar96._0_10_ = auVar219._0_10_;
  auVar96._11_4_ = auVar95._11_4_;
  auVar97[9] = 0;
  auVar97._0_9_ = auVar219._0_9_;
  auVar97._10_5_ = auVar96._10_5_;
  auVar98[8] = SUB41(fVar227,0);
  auVar98._0_8_ = auVar219._0_8_;
  auVar98._9_6_ = auVar97._9_6_;
  Var69 = CONCAT81(CONCAT71(auVar98._8_7_,local_418[3]),(char)((uint)fVar217 >> 0x18));
  auVar99._6_9_ = Var69;
  auVar99[5] = local_418[2];
  auVar99[4] = (char)((uint)fVar217 >> 0x10);
  auVar99._0_4_ = fVar217;
  auVar100._2_11_ = auVar99._4_11_;
  auVar100[1] = local_418[1];
  auVar100[0] = (char)((uint)fVar217 >> 8);
  sVar147 = CONCAT11(local_418[0],SUB41(fVar217,0));
  auVar101._2_13_ = auVar100;
  auVar101._0_2_ = sVar147;
  uVar144 = (undefined2)Var69;
  auVar223._0_12_ = auVar101._0_12_;
  auVar223._12_2_ = uVar144;
  auVar223._14_2_ = uVar144;
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._0_10_ = auVar101._0_10_;
  auVar222._10_2_ = auVar99._4_2_;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._0_8_ = auVar101._0_8_;
  auVar221._8_2_ = auVar99._4_2_;
  auVar79._4_8_ = auVar221._8_8_;
  auVar79._2_2_ = auVar100._0_2_;
  auVar79._0_2_ = auVar100._0_2_;
  fVar218 = (float)((int)sVar147 >> 8);
  fVar228 = (float)(auVar79._0_4_ >> 0x18);
  fVar229 = (float)(auVar221._8_4_ >> 0x18);
  uVar302 = (undefined1)((uint)uVar14 >> 0x18);
  uVar144 = CONCAT11(uVar302,uVar302);
  uVar302 = (undefined1)((uint)uVar14 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar144,uVar302),CONCAT14(uVar302,uVar14));
  uVar302 = (undefined1)((uint)uVar14 >> 8);
  uVar80 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar302),uVar302);
  sVar147 = CONCAT11((char)uVar14,(char)uVar14);
  uVar109 = CONCAT62(uVar80,sVar147);
  auVar394._8_4_ = 0;
  auVar394._0_8_ = uVar109;
  auVar394._12_2_ = uVar144;
  auVar394._14_2_ = uVar144;
  uVar144 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar393._12_4_ = auVar394._12_4_;
  auVar393._8_2_ = 0;
  auVar393._0_8_ = uVar109;
  auVar393._10_2_ = uVar144;
  auVar392._10_6_ = auVar393._10_6_;
  auVar392._8_2_ = uVar144;
  auVar392._0_8_ = uVar109;
  uVar144 = (undefined2)uVar80;
  auVar81._4_8_ = auVar392._8_8_;
  auVar81._2_2_ = uVar144;
  auVar81._0_2_ = uVar144;
  fVar390 = (float)((int)sVar147 >> 8);
  fVar399 = (float)(auVar81._0_4_ >> 0x18);
  fVar401 = (float)(auVar392._8_4_ >> 0x18);
  uVar302 = (undefined1)((uint)uVar17 >> 0x18);
  uVar144 = CONCAT11(uVar302,uVar302);
  uVar302 = (undefined1)((uint)uVar17 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar144,uVar302),CONCAT14(uVar302,uVar17));
  uVar302 = (undefined1)((uint)uVar17 >> 8);
  uVar80 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar302),uVar302);
  sVar147 = CONCAT11((char)uVar17,(char)uVar17);
  uVar109 = CONCAT62(uVar80,sVar147);
  auVar293._8_4_ = 0;
  auVar293._0_8_ = uVar109;
  auVar293._12_2_ = uVar144;
  auVar293._14_2_ = uVar144;
  uVar144 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar292._12_4_ = auVar293._12_4_;
  auVar292._8_2_ = 0;
  auVar292._0_8_ = uVar109;
  auVar292._10_2_ = uVar144;
  auVar291._10_6_ = auVar292._10_6_;
  auVar291._8_2_ = uVar144;
  auVar291._0_8_ = uVar109;
  uVar144 = (undefined2)uVar80;
  auVar82._4_8_ = auVar291._8_8_;
  auVar82._2_2_ = uVar144;
  auVar82._0_2_ = uVar144;
  fVar288 = (float)((int)sVar147 >> 8);
  fVar303 = (float)(auVar82._0_4_ >> 0x18);
  fVar309 = (float)(auVar291._8_4_ >> 0x18);
  uVar302 = (undefined1)((uint)uVar18 >> 0x18);
  uVar144 = CONCAT11(uVar302,uVar302);
  uVar302 = (undefined1)((uint)uVar18 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar144,uVar302),CONCAT14(uVar302,uVar18));
  uVar302 = (undefined1)((uint)uVar18 >> 8);
  uVar80 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar302),uVar302);
  sVar147 = CONCAT11((char)uVar18,(char)uVar18);
  uVar109 = CONCAT62(uVar80,sVar147);
  auVar380._8_4_ = 0;
  auVar380._0_8_ = uVar109;
  auVar380._12_2_ = uVar144;
  auVar380._14_2_ = uVar144;
  uVar144 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar379._12_4_ = auVar380._12_4_;
  auVar379._8_2_ = 0;
  auVar379._0_8_ = uVar109;
  auVar379._10_2_ = uVar144;
  auVar378._10_6_ = auVar379._10_6_;
  auVar378._8_2_ = uVar144;
  auVar378._0_8_ = uVar109;
  uVar144 = (undefined2)uVar80;
  auVar83._4_8_ = auVar378._8_8_;
  auVar83._2_2_ = uVar144;
  auVar83._0_2_ = uVar144;
  fVar376 = (float)((int)sVar147 >> 8);
  fVar385 = (float)(auVar83._0_4_ >> 0x18);
  fVar387 = (float)(auVar378._8_4_ >> 0x18);
  uVar302 = (undefined1)((uint)uVar19 >> 0x18);
  uVar144 = CONCAT11(uVar302,uVar302);
  uVar302 = (undefined1)((uint)uVar19 >> 0x10);
  uVar5 = CONCAT35(CONCAT21(uVar144,uVar302),CONCAT14(uVar302,uVar19));
  uVar302 = (undefined1)((uint)uVar19 >> 8);
  uVar80 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar302),uVar302);
  sVar147 = CONCAT11((char)uVar19,(char)uVar19);
  uVar109 = CONCAT62(uVar80,sVar147);
  auVar417._8_4_ = 0;
  auVar417._0_8_ = uVar109;
  auVar417._12_2_ = uVar144;
  auVar417._14_2_ = uVar144;
  uVar144 = (undefined2)((ulong)uVar5 >> 0x20);
  auVar416._12_4_ = auVar417._12_4_;
  auVar416._8_2_ = 0;
  auVar416._0_8_ = uVar109;
  auVar416._10_2_ = uVar144;
  auVar415._10_6_ = auVar416._10_6_;
  auVar415._8_2_ = uVar144;
  auVar415._0_8_ = uVar109;
  uVar144 = (undefined2)uVar80;
  auVar84._4_8_ = auVar415._8_8_;
  auVar84._2_2_ = uVar144;
  auVar84._0_2_ = uVar144;
  fVar189 = (float)((int)sVar147 >> 8);
  fVar214 = (float)(auVar84._0_4_ >> 0x18);
  fVar216 = (float)(auVar415._8_4_ >> 0x18);
  fVar414 = fVar359 * fVar218 + fVar368 * (float)iVar148 + fVar371 * (float)iVar183;
  fVar420 = fVar359 * fVar228 + fVar368 * fVar267 + fVar371 * fVar352;
  fVar421 = fVar359 * fVar229 + fVar368 * (float)auVar149._8_4_ + fVar371 * (float)auVar150._8_4_;
  fVar422 = fVar359 * (float)(auVar222._12_4_ >> 0x18) +
            fVar368 * (float)auVar155._12_4_ + fVar371 * (float)auVar159._12_4_;
  fVar405 = fVar359 * fVar390 + fVar368 * (float)iVar184 + fVar217;
  fVar411 = fVar359 * fVar399 + fVar368 * fVar287 + fVar227;
  fVar412 = fVar359 * fVar401 + fVar368 * (float)auVar151._8_4_ + auVar219._8_4_;
  fVar413 = fVar359 * (float)(auVar393._12_4_ >> 0x18) +
            fVar368 * (float)auVar163._12_4_ + auVar220._12_4_;
  fVar253 = fVar359 * fVar288 + fVar368 * fVar376 + fVar371 * fVar189;
  fVar264 = fVar359 * fVar303 + fVar368 * fVar385 + fVar371 * fVar214;
  fVar265 = fVar359 * fVar309 + fVar368 * fVar387 + fVar371 * fVar216;
  fVar359 = fVar359 * (float)(auVar292._12_4_ >> 0x18) +
            fVar368 * (float)(auVar379._12_4_ >> 0x18) + fVar371 * (float)(auVar416._12_4_ >> 0x18);
  uVar5 = *(undefined8 *)(prim + uVar103 * 7 + 6);
  uVar6 = *(undefined8 *)(prim + uVar103 * 0xb + 6);
  uVar7 = *(undefined8 *)(prim + uVar103 * 9 + 6);
  uVar8 = *(undefined8 *)(prim + uVar103 * 0xd + 6);
  uVar109 = *(ulong *)(prim + uVar103 * 0x12 + 6);
  fVar368 = fVar218 * fVar117 + (float)iVar148 * fVar145 + (float)iVar183 * fVar146;
  fVar352 = fVar228 * fVar117 + fVar267 * fVar145 + fVar352 * fVar146;
  fVar230 = fVar229 * fVar117 + (float)auVar149._8_4_ * fVar145 + (float)auVar150._8_4_ * fVar146;
  fVar231 = (float)(auVar222._12_4_ >> 0x18) * fVar117 +
            (float)auVar155._12_4_ * fVar145 + (float)auVar159._12_4_ * fVar146;
  fVar390 = fVar390 * fVar117 + (float)iVar184 * fVar145 + fVar320 * fVar146;
  fVar399 = fVar399 * fVar117 + fVar287 * fVar145 + fVar336 * fVar146;
  fVar401 = fVar401 * fVar117 + (float)auVar151._8_4_ * fVar145 + fVar339 * fVar146;
  fVar403 = (float)(auVar393._12_4_ >> 0x18) * fVar117 +
            (float)auVar163._12_4_ * fVar145 + (float)(auVar165._12_4_ >> 0x18) * fVar146;
  fVar217 = fVar117 * fVar288 + fVar145 * fVar376 + fVar146 * fVar189;
  fVar218 = fVar117 * fVar303 + fVar145 * fVar385 + fVar146 * fVar214;
  fVar227 = fVar117 * fVar309 + fVar145 * fVar387 + fVar146 * fVar216;
  fVar228 = fVar117 * (float)(auVar292._12_4_ >> 0x18) +
            fVar145 * (float)(auVar379._12_4_ >> 0x18) + fVar146 * (float)(auVar416._12_4_ >> 0x18);
  fVar371 = (float)DAT_01f4bd50;
  fVar117 = DAT_01f4bd50._4_4_;
  fVar145 = DAT_01f4bd50._8_4_;
  fVar146 = DAT_01f4bd50._12_4_;
  uVar113 = -(uint)(fVar371 <= ABS(fVar414));
  uVar114 = -(uint)(fVar117 <= ABS(fVar420));
  uVar115 = -(uint)(fVar145 <= ABS(fVar421));
  uVar116 = -(uint)(fVar146 <= ABS(fVar422));
  auVar418._0_4_ = (uint)fVar414 & uVar113;
  auVar418._4_4_ = (uint)fVar420 & uVar114;
  auVar418._8_4_ = (uint)fVar421 & uVar115;
  auVar418._12_4_ = (uint)fVar422 & uVar116;
  auVar190._0_4_ = ~uVar113 & (uint)fVar371;
  auVar190._4_4_ = ~uVar114 & (uint)fVar117;
  auVar190._8_4_ = ~uVar115 & (uint)fVar145;
  auVar190._12_4_ = ~uVar116 & (uint)fVar146;
  auVar190 = auVar190 | auVar418;
  uVar113 = -(uint)(fVar371 <= ABS(fVar405));
  uVar114 = -(uint)(fVar117 <= ABS(fVar411));
  uVar115 = -(uint)(fVar145 <= ABS(fVar412));
  uVar116 = -(uint)(fVar146 <= ABS(fVar413));
  auVar406._0_4_ = (uint)fVar405 & uVar113;
  auVar406._4_4_ = (uint)fVar411 & uVar114;
  auVar406._8_4_ = (uint)fVar412 & uVar115;
  auVar406._12_4_ = (uint)fVar413 & uVar116;
  auVar270._0_4_ = ~uVar113 & (uint)fVar371;
  auVar270._4_4_ = ~uVar114 & (uint)fVar117;
  auVar270._8_4_ = ~uVar115 & (uint)fVar145;
  auVar270._12_4_ = ~uVar116 & (uint)fVar146;
  auVar270 = auVar270 | auVar406;
  uVar113 = -(uint)(fVar371 <= ABS(fVar253));
  uVar114 = -(uint)(fVar117 <= ABS(fVar264));
  uVar115 = -(uint)(fVar145 <= ABS(fVar265));
  uVar116 = -(uint)(fVar146 <= ABS(fVar359));
  auVar254._0_4_ = (uint)fVar253 & uVar113;
  auVar254._4_4_ = (uint)fVar264 & uVar114;
  auVar254._8_4_ = (uint)fVar265 & uVar115;
  auVar254._12_4_ = (uint)fVar359 & uVar116;
  auVar407._0_4_ = ~uVar113 & (uint)fVar371;
  auVar407._4_4_ = ~uVar114 & (uint)fVar117;
  auVar407._8_4_ = ~uVar115 & (uint)fVar145;
  auVar407._12_4_ = ~uVar116 & (uint)fVar146;
  auVar407 = auVar407 | auVar254;
  auVar233 = rcpps(_DAT_01f4bd50,auVar190);
  auVar234._0_4_ = auVar233._0_4_;
  auVar191._0_4_ = auVar190._0_4_ * auVar234._0_4_;
  fVar303 = auVar233._4_4_;
  auVar191._4_4_ = auVar190._4_4_ * fVar303;
  fVar309 = auVar233._8_4_;
  auVar191._8_4_ = auVar190._8_4_ * fVar309;
  fVar320 = auVar233._12_4_;
  auVar191._12_4_ = auVar190._12_4_ * fVar320;
  fVar339 = (1.0 - auVar191._0_4_) * auVar234._0_4_ + auVar234._0_4_;
  fVar303 = (1.0 - auVar191._4_4_) * fVar303 + fVar303;
  fVar309 = (1.0 - auVar191._8_4_) * fVar309 + fVar309;
  fVar320 = (1.0 - auVar191._12_4_) * fVar320 + fVar320;
  auVar192 = rcpps(auVar191,auVar270);
  fVar229 = auVar192._0_4_;
  fVar264 = auVar192._4_4_;
  fVar359 = auVar192._8_4_;
  fVar287 = auVar192._12_4_;
  fVar229 = (1.0 - auVar270._0_4_ * fVar229) * fVar229 + fVar229;
  fVar264 = (1.0 - auVar270._4_4_ * fVar264) * fVar264 + fVar264;
  fVar359 = (1.0 - auVar270._8_4_ * fVar359) * fVar359 + fVar359;
  fVar287 = (1.0 - auVar270._12_4_ * fVar287) * fVar287 + fVar287;
  auVar192 = rcpps(auVar192,auVar407);
  fVar253 = auVar192._0_4_;
  fVar265 = auVar192._4_4_;
  fVar267 = auVar192._8_4_;
  fVar288 = auVar192._12_4_;
  uVar9 = *(undefined8 *)(prim + uVar103 * 0x16 + 6);
  fVar253 = (1.0 - auVar407._0_4_ * fVar253) * fVar253 + fVar253;
  fVar265 = (1.0 - auVar407._4_4_ * fVar265) * fVar265 + fVar265;
  fVar267 = (1.0 - auVar407._8_4_ * fVar267) * fVar267 + fVar267;
  fVar288 = (1.0 - auVar407._12_4_ * fVar288) * fVar288 + fVar288;
  uVar104 = *(ulong *)(prim + uVar103 * 0x14 + 6);
  auVar237._0_12_ = auVar233._0_12_;
  auVar237._12_2_ = auVar233._6_2_;
  auVar237._14_2_ = (short)((ulong)uVar5 >> 0x30);
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._0_10_ = auVar233._0_10_;
  auVar236._10_2_ = (short)((ulong)uVar5 >> 0x20);
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._0_8_ = auVar233._0_8_;
  auVar235._8_2_ = auVar233._4_2_;
  auVar234._8_8_ = auVar235._8_8_;
  sVar147 = (short)((ulong)uVar5 >> 0x10);
  auVar234._6_2_ = sVar147;
  auVar234._4_2_ = auVar233._2_2_;
  auVar238._0_4_ = (int)(short)uVar5;
  iVar148 = auVar234._4_4_ >> 0x10;
  auVar232._0_8_ = CONCAT44(iVar148,auVar238._0_4_);
  auVar232._8_4_ = auVar235._8_4_ >> 0x10;
  auVar271._0_4_ = (float)auVar238._0_4_;
  fVar336 = (float)iVar148;
  auVar268._0_8_ = CONCAT44(fVar336,auVar271._0_4_);
  auVar268._8_4_ = (float)auVar232._8_4_;
  auVar241._12_2_ = sVar147 >> 0xf;
  auVar241._0_12_ = auVar232;
  auVar241._14_2_ = (short)((ulong)uVar6 >> 0x30);
  auVar240._12_4_ = auVar241._12_4_;
  auVar240._0_10_ = auVar232._0_10_;
  auVar240._10_2_ = (short)((ulong)uVar6 >> 0x20);
  auVar239._10_6_ = auVar240._10_6_;
  auVar239._8_2_ = sVar147;
  auVar239._0_8_ = auVar232._0_8_;
  auVar238._8_8_ = auVar239._8_8_;
  auVar238._6_2_ = (short)((ulong)uVar6 >> 0x10);
  auVar238._4_2_ = (short)uVar5 >> 0xf;
  uVar5 = *(undefined8 *)(prim + uVar103 * 0x18 + 6);
  auVar274._12_2_ = (short)((uint)fVar336 >> 0x10);
  auVar274._0_12_ = auVar268;
  auVar274._14_2_ = (short)((ulong)uVar7 >> 0x30);
  auVar273._12_4_ = auVar274._12_4_;
  auVar273._0_10_ = auVar268._0_10_;
  auVar273._10_2_ = (short)((ulong)uVar7 >> 0x20);
  auVar272._10_6_ = auVar273._10_6_;
  auVar272._8_2_ = SUB42(fVar336,0);
  auVar272._0_8_ = auVar268._0_8_;
  auVar271._8_8_ = auVar272._8_8_;
  sVar147 = (short)((ulong)uVar7 >> 0x10);
  auVar271._6_2_ = sVar147;
  auVar271._4_2_ = (short)((uint)auVar271._0_4_ >> 0x10);
  auVar275._0_4_ = (int)(short)uVar7;
  iVar148 = auVar271._4_4_ >> 0x10;
  auVar269._0_8_ = CONCAT44(iVar148,auVar275._0_4_);
  auVar269._8_4_ = auVar272._8_4_ >> 0x10;
  auVar324._0_4_ = (float)auVar275._0_4_;
  fVar376 = (float)iVar148;
  auVar323._0_8_ = CONCAT44(fVar376,auVar324._0_4_);
  auVar323._8_4_ = (float)auVar269._8_4_;
  auVar278._12_2_ = sVar147 >> 0xf;
  auVar278._0_12_ = auVar269;
  auVar278._14_2_ = (short)((ulong)uVar8 >> 0x30);
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._0_10_ = auVar269._0_10_;
  auVar277._10_2_ = (short)((ulong)uVar8 >> 0x20);
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._8_2_ = sVar147;
  auVar276._0_8_ = auVar269._0_8_;
  auVar275._8_8_ = auVar276._8_8_;
  auVar275._6_2_ = (short)((ulong)uVar8 >> 0x10);
  auVar275._4_2_ = (short)uVar7 >> 0xf;
  uVar144 = (undefined2)(uVar109 >> 0x30);
  auVar171._8_4_ = 0;
  auVar171._0_8_ = uVar109;
  auVar171._12_2_ = uVar144;
  auVar171._14_2_ = uVar144;
  uVar144 = (undefined2)(uVar109 >> 0x20);
  auVar233._12_4_ = auVar171._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar109;
  auVar233._10_2_ = uVar144;
  auVar192._10_6_ = auVar233._10_6_;
  auVar192._8_2_ = uVar144;
  auVar192._0_8_ = uVar109;
  uVar144 = (undefined2)(uVar109 >> 0x10);
  auVar85._4_8_ = auVar192._8_8_;
  auVar85._2_2_ = uVar144;
  auVar85._0_2_ = uVar144;
  auVar119._0_4_ = (float)(int)(short)uVar109;
  fVar371 = (float)(auVar85._0_4_ >> 0x10);
  auVar118._0_8_ = CONCAT44(fVar371,auVar119._0_4_);
  auVar118._8_4_ = (float)(auVar192._8_4_ >> 0x10);
  auVar327._12_2_ = (short)((uint)fVar376 >> 0x10);
  auVar327._0_12_ = auVar323;
  auVar327._14_2_ = (short)((ulong)uVar9 >> 0x30);
  auVar326._12_4_ = auVar327._12_4_;
  auVar326._0_10_ = auVar323._0_10_;
  auVar326._10_2_ = (short)((ulong)uVar9 >> 0x20);
  auVar325._10_6_ = auVar326._10_6_;
  auVar325._8_2_ = SUB42(fVar376,0);
  auVar325._0_8_ = auVar323._0_8_;
  auVar324._8_8_ = auVar325._8_8_;
  auVar324._6_2_ = (short)((ulong)uVar9 >> 0x10);
  auVar324._4_2_ = (short)((uint)auVar324._0_4_ >> 0x10);
  uVar215 = (undefined2)(uVar104 >> 0x30);
  auVar204._12_2_ = (short)((uint)fVar371 >> 0x10);
  auVar204._0_12_ = auVar118;
  auVar204._14_2_ = uVar215;
  auVar330._12_4_ = auVar204._12_4_;
  auVar330._0_10_ = auVar118._0_10_;
  uVar213 = (undefined2)(uVar104 >> 0x20);
  auVar330._10_2_ = uVar213;
  auVar120._10_6_ = auVar330._10_6_;
  auVar120._8_2_ = SUB42(fVar371,0);
  auVar120._0_8_ = auVar118._0_8_;
  auVar119._8_8_ = auVar120._8_8_;
  uVar144 = (undefined2)(uVar104 >> 0x10);
  auVar119._6_2_ = uVar144;
  auVar119._4_2_ = (short)((uint)auVar119._0_4_ >> 0x10);
  fVar117 = (float)(auVar119._4_4_ >> 0x10);
  fVar189 = (float)(auVar120._8_4_ >> 0x10);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar104;
  auVar195._12_2_ = uVar215;
  auVar195._14_2_ = (short)((ulong)uVar5 >> 0x30);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar104;
  auVar194._10_2_ = (short)((ulong)uVar5 >> 0x20);
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar213;
  auVar193._0_8_ = uVar104;
  auVar86._4_8_ = auVar193._8_8_;
  auVar86._2_2_ = (short)((ulong)uVar5 >> 0x10);
  auVar86._0_2_ = uVar144;
  uVar109 = *(ulong *)(prim + uVar103 * 0x1d + 6);
  uVar144 = (undefined2)(uVar109 >> 0x30);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar109;
  auVar123._12_2_ = uVar144;
  auVar123._14_2_ = uVar144;
  uVar144 = (undefined2)(uVar109 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar109;
  auVar122._10_2_ = uVar144;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar144;
  auVar121._0_8_ = uVar109;
  uVar144 = (undefined2)(uVar109 >> 0x10);
  auVar87._4_8_ = auVar121._8_8_;
  auVar87._2_2_ = uVar144;
  auVar87._0_2_ = uVar144;
  fVar145 = (float)(auVar87._0_4_ >> 0x10);
  fVar214 = (float)(auVar121._8_4_ >> 0x10);
  uVar105 = *(ulong *)(prim + uVar103 * 0x21 + 6);
  uVar144 = (undefined2)(uVar105 >> 0x30);
  auVar198._8_4_ = 0;
  auVar198._0_8_ = uVar105;
  auVar198._12_2_ = uVar144;
  auVar198._14_2_ = uVar144;
  uVar144 = (undefined2)(uVar105 >> 0x20);
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._8_2_ = 0;
  auVar197._0_8_ = uVar105;
  auVar197._10_2_ = uVar144;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._8_2_ = uVar144;
  auVar196._0_8_ = uVar105;
  uVar144 = (undefined2)(uVar105 >> 0x10);
  auVar88._4_8_ = auVar196._8_8_;
  auVar88._2_2_ = uVar144;
  auVar88._0_2_ = uVar144;
  uVar10 = *(ulong *)(prim + uVar103 * 0x1f + 6);
  uVar144 = (undefined2)(uVar10 >> 0x30);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar10;
  auVar126._12_2_ = uVar144;
  auVar126._14_2_ = uVar144;
  uVar144 = (undefined2)(uVar10 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar10;
  auVar125._10_2_ = uVar144;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar144;
  auVar124._0_8_ = uVar10;
  uVar144 = (undefined2)(uVar10 >> 0x10);
  auVar89._4_8_ = auVar124._8_8_;
  auVar89._2_2_ = uVar144;
  auVar89._0_2_ = uVar144;
  fVar146 = (float)(auVar89._0_4_ >> 0x10);
  fVar216 = (float)(auVar124._8_4_ >> 0x10);
  uVar103 = *(ulong *)(prim + uVar103 * 0x23 + 6);
  uVar144 = (undefined2)(uVar103 >> 0x30);
  auVar201._8_4_ = 0;
  auVar201._0_8_ = uVar103;
  auVar201._12_2_ = uVar144;
  auVar201._14_2_ = uVar144;
  uVar144 = (undefined2)(uVar103 >> 0x20);
  auVar200._12_4_ = auVar201._12_4_;
  auVar200._8_2_ = 0;
  auVar200._0_8_ = uVar103;
  auVar200._10_2_ = uVar144;
  auVar199._10_6_ = auVar200._10_6_;
  auVar199._8_2_ = uVar144;
  auVar199._0_8_ = uVar103;
  uVar144 = (undefined2)(uVar103 >> 0x10);
  auVar90._4_8_ = auVar199._8_8_;
  auVar90._2_2_ = uVar144;
  auVar90._0_2_ = uVar144;
  auVar242._0_8_ =
       CONCAT44(((((float)(auVar238._4_4_ >> 0x10) - fVar336) * fVar188 + fVar336) - fVar352) *
                fVar303,((((float)(int)(short)uVar6 - auVar271._0_4_) * fVar188 + auVar271._0_4_) -
                        fVar368) * fVar339);
  auVar242._8_4_ =
       ((((float)(auVar239._8_4_ >> 0x10) - auVar268._8_4_) * fVar188 + auVar268._8_4_) - fVar230) *
       fVar309;
  auVar242._12_4_ =
       ((((float)(auVar240._12_4_ >> 0x10) - (float)(auVar236._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar236._12_4_ >> 0x10)) - fVar231) * fVar320;
  auVar279._0_4_ =
       ((((float)(int)(short)uVar8 - auVar324._0_4_) * fVar188 + auVar324._0_4_) - fVar368) *
       fVar339;
  auVar279._4_4_ =
       ((((float)(auVar275._4_4_ >> 0x10) - fVar376) * fVar188 + fVar376) - fVar352) * fVar303;
  auVar279._8_4_ =
       ((((float)(auVar276._8_4_ >> 0x10) - auVar323._8_4_) * fVar188 + auVar323._8_4_) - fVar230) *
       fVar309;
  auVar279._12_4_ =
       ((((float)(auVar277._12_4_ >> 0x10) - (float)(auVar273._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar273._12_4_ >> 0x10)) - fVar231) * fVar320;
  auVar328._0_8_ =
       CONCAT44(((((float)(auVar324._4_4_ >> 0x10) - fVar371) * fVar188 + fVar371) - fVar399) *
                fVar264,((((float)(int)(short)uVar9 - auVar119._0_4_) * fVar188 + auVar119._0_4_) -
                        fVar390) * fVar229);
  auVar328._8_4_ =
       ((((float)(auVar325._8_4_ >> 0x10) - auVar118._8_4_) * fVar188 + auVar118._8_4_) - fVar401) *
       fVar359;
  auVar328._12_4_ =
       ((((float)(auVar326._12_4_ >> 0x10) - (float)(auVar233._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar233._12_4_ >> 0x10)) - fVar403) * fVar287;
  auVar346._0_4_ =
       ((((float)(int)(short)uVar5 - (float)(int)(short)uVar104) * fVar188 +
        (float)(int)(short)uVar104) - fVar390) * fVar229;
  auVar346._4_4_ =
       ((((float)(auVar86._0_4_ >> 0x10) - fVar117) * fVar188 + fVar117) - fVar399) * fVar264;
  auVar346._8_4_ =
       ((((float)(auVar193._8_4_ >> 0x10) - fVar189) * fVar188 + fVar189) - fVar401) * fVar359;
  auVar346._12_4_ =
       ((((float)(auVar194._12_4_ >> 0x10) - (float)(auVar330._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar330._12_4_ >> 0x10)) - fVar403) * fVar287;
  auVar362._0_8_ =
       CONCAT44(((((float)(auVar88._0_4_ >> 0x10) - fVar145) * fVar188 + fVar145) - fVar218) *
                fVar265,((((float)(int)(short)uVar105 - (float)(int)(short)uVar109) * fVar188 +
                         (float)(int)(short)uVar109) - fVar217) * fVar253);
  auVar362._8_4_ =
       ((((float)(auVar196._8_4_ >> 0x10) - fVar214) * fVar188 + fVar214) - fVar227) * fVar267;
  auVar362._12_4_ =
       ((((float)(auVar197._12_4_ >> 0x10) - (float)(auVar122._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar122._12_4_ >> 0x10)) - fVar228) * fVar288;
  auVar381._0_4_ =
       ((((float)(int)(short)uVar103 - (float)(int)(short)uVar10) * fVar188 +
        (float)(int)(short)uVar10) - fVar217) * fVar253;
  auVar381._4_4_ =
       ((((float)(auVar90._0_4_ >> 0x10) - fVar146) * fVar188 + fVar146) - fVar218) * fVar265;
  auVar381._8_4_ =
       ((((float)(auVar199._8_4_ >> 0x10) - fVar216) * fVar188 + fVar216) - fVar227) * fVar267;
  auVar381._12_4_ =
       ((((float)(auVar200._12_4_ >> 0x10) - (float)(auVar125._12_4_ >> 0x10)) * fVar188 +
        (float)(auVar125._12_4_ >> 0x10)) - fVar228) * fVar288;
  auVar202._8_4_ = auVar242._8_4_;
  auVar202._0_8_ = auVar242._0_8_;
  auVar202._12_4_ = auVar242._12_4_;
  auVar233 = minps(auVar202,auVar279);
  auVar127._8_4_ = auVar328._8_4_;
  auVar127._0_8_ = auVar328._0_8_;
  auVar127._12_4_ = auVar328._12_4_;
  auVar192 = minps(auVar127,auVar346);
  auVar233 = maxps(auVar233,auVar192);
  auVar128._8_4_ = auVar362._8_4_;
  auVar128._0_8_ = auVar362._0_8_;
  auVar128._12_4_ = auVar362._12_4_;
  auVar192 = minps(auVar128,auVar381);
  uVar108 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar167._4_4_ = uVar108;
  auVar167._0_4_ = uVar108;
  auVar167._8_4_ = uVar108;
  auVar167._12_4_ = uVar108;
  auVar192 = maxps(auVar192,auVar167);
  auVar192 = maxps(auVar233,auVar192);
  local_188 = auVar192._0_4_ * 0.99999964;
  fStack_184 = auVar192._4_4_ * 0.99999964;
  fStack_180 = auVar192._8_4_ * 0.99999964;
  fStack_17c = auVar192._12_4_ * 0.99999964;
  auVar192 = maxps(auVar242,auVar279);
  auVar233 = maxps(auVar328,auVar346);
  auVar192 = minps(auVar192,auVar233);
  auVar233 = maxps(auVar362,auVar381);
  fVar371 = ray->tfar;
  auVar129._4_4_ = fVar371;
  auVar129._0_4_ = fVar371;
  auVar129._8_4_ = fVar371;
  auVar129._12_4_ = fVar371;
  auVar233 = minps(auVar233,auVar129);
  auVar192 = minps(auVar192,auVar233);
  auVar168._0_4_ = -(uint)(PVar11 != (Primitive)0x0 && local_188 <= auVar192._0_4_ * 1.0000004);
  auVar168._4_4_ = -(uint)(1 < (byte)PVar11 && fStack_184 <= auVar192._4_4_ * 1.0000004);
  auVar168._8_4_ = -(uint)(2 < (byte)PVar11 && fStack_180 <= auVar192._8_4_ * 1.0000004);
  auVar168._12_4_ = -(uint)(3 < (byte)PVar11 && fStack_17c <= auVar192._12_4_ * 1.0000004);
  uVar108 = movmskps((int)unaff_RBP,auVar168);
  uVar109 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar108);
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_290 = prim;
LAB_003ae43c:
  if (uVar109 == 0) {
LAB_003b08b2:
    return uVar109 != 0;
  }
  lVar110 = 0;
  if (uVar109 != 0) {
    for (; (uVar109 >> lVar110 & 1) == 0; lVar110 = lVar110 + 1) {
    }
  }
  uVar113 = *(uint *)(local_290 + 2);
  uVar114 = *(uint *)(local_290 + lVar110 * 4 + 6);
  pGVar20 = (context->scene->geometries).items[uVar113].ptr;
  fVar371 = pGVar20->fnumTimeSegments;
  fVar117 = (pGVar20->time_range).lower;
  fVar145 = (((ray->dir).field_0.m128[3] - fVar117) / ((pGVar20->time_range).upper - fVar117)) *
            fVar371;
  fVar117 = floorf(fVar145);
  fVar371 = fVar371 + -1.0;
  if (fVar371 <= fVar117) {
    fVar117 = fVar371;
  }
  fVar371 = 0.0;
  if (0.0 <= fVar117) {
    fVar371 = fVar117;
  }
  uVar104 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                            (ulong)uVar114 *
                            pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar107 = (long)(int)fVar371 * 0x38;
  lVar22 = *(long *)(_Var21 + 0x10 + lVar107);
  pfVar1 = (float *)(*(long *)(_Var21 + lVar107) + lVar22 * uVar104);
  fVar117 = *pfVar1;
  fVar146 = pfVar1[1];
  fVar189 = pfVar1[2];
  fVar214 = pfVar1[3];
  lVar110 = uVar104 + 1;
  pfVar1 = (float *)(*(long *)(_Var21 + lVar107) + lVar22 * lVar110);
  fVar216 = *pfVar1;
  fVar217 = pfVar1[1];
  fVar218 = pfVar1[2];
  fVar227 = pfVar1[3];
  p_Var106 = pGVar20[4].occlusionFilterN;
  lVar22 = *(long *)&pGVar20[4].fnumTimeSegments;
  lVar23 = *(long *)(lVar22 + 0x10 + lVar107);
  pfVar1 = (float *)(*(long *)(lVar22 + lVar107) + lVar23 * uVar104);
  fVar228 = *pfVar1;
  fVar188 = pfVar1[1];
  fVar229 = pfVar1[2];
  fVar253 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar22 + lVar107) + lVar23 * lVar110);
  fVar264 = *pfVar1;
  fVar265 = pfVar1[1];
  fVar359 = pfVar1[2];
  fVar267 = pfVar1[3];
  _Var24 = pGVar20[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar23 = *(long *)(_Var24 + 0x10 + lVar107);
  pfVar1 = (float *)(*(long *)(_Var24 + lVar107) + lVar23 * uVar104);
  pfVar2 = (float *)(*(long *)(_Var24 + lVar107) + lVar23 * lVar110);
  pfVar3 = (float *)(*(long *)(p_Var106 + lVar107) + *(long *)(p_Var106 + lVar107 + 0x10) * uVar104)
  ;
  fVar145 = fVar145 - fVar371;
  fVar371 = *pfVar3 * 0.33333334 + fVar117;
  fVar287 = pfVar3[1] * 0.33333334 + fVar146;
  fVar288 = pfVar3[2] * 0.33333334 + fVar189;
  fVar368 = pfVar3[3] * 0.33333334 + fVar214;
  pfVar3 = (float *)(*(long *)(p_Var106 + lVar107) + *(long *)(p_Var106 + lVar107 + 0x10) * lVar110)
  ;
  fVar339 = fVar216 - *pfVar3 * 0.33333334;
  fVar390 = fVar217 - pfVar3[1] * 0.33333334;
  fVar403 = fVar218 - pfVar3[2] * 0.33333334;
  fVar411 = fVar227 - pfVar3[3] * 0.33333334;
  fVar303 = *pfVar1 * 0.33333334 + fVar228;
  fVar399 = pfVar1[1] * 0.33333334 + fVar188;
  fVar420 = pfVar1[2] * 0.33333334 + fVar229;
  fVar421 = pfVar1[3] * 0.33333334 + fVar253;
  fVar422 = fVar264 - *pfVar2 * 0.33333334;
  fVar304 = fVar265 - pfVar2[1] * 0.33333334;
  fVar310 = fVar359 - pfVar2[2] * 0.33333334;
  fVar315 = fVar267 - pfVar2[3] * 0.33333334;
  fVar352 = fVar339 * 0.0;
  fVar230 = fVar390 * 0.0;
  fVar231 = fVar403 * 0.0;
  fVar320 = fVar411 * 0.0;
  fVar309 = fVar216 * 0.0 + fVar352;
  fVar336 = fVar217 * 0.0 + fVar230;
  fVar376 = fVar218 * 0.0 + fVar231;
  fVar387 = fVar227 * 0.0 + fVar320;
  fVar344 = fVar371 * 0.0;
  fVar353 = fVar287 * 0.0;
  fVar355 = fVar288 * 0.0;
  fVar357 = fVar368 * 0.0;
  fVar385 = fVar344 + fVar309 + fVar117;
  fVar401 = fVar353 + fVar336 + fVar146;
  fVar405 = fVar355 + fVar376 + fVar189;
  fVar412 = fVar357 + fVar387 + fVar214;
  fVar309 = (fVar371 * 3.0 + fVar309) - fVar117 * 3.0;
  fVar336 = (fVar287 * 3.0 + fVar336) - fVar146 * 3.0;
  fVar376 = (fVar288 * 3.0 + fVar376) - fVar189 * 3.0;
  fVar387 = (fVar368 * 3.0 + fVar387) - fVar214 * 3.0;
  fVar345 = fVar422 * 0.0;
  fVar354 = fVar304 * 0.0;
  fVar356 = fVar310 * 0.0;
  fVar358 = fVar315 * 0.0;
  fVar371 = fVar264 * 0.0 + fVar345;
  fVar287 = fVar265 * 0.0 + fVar354;
  fVar288 = fVar359 * 0.0 + fVar356;
  fVar368 = fVar267 * 0.0 + fVar358;
  fVar360 = fVar303 * 0.0;
  fVar369 = fVar399 * 0.0;
  fVar372 = fVar420 * 0.0;
  fVar374 = fVar421 * 0.0;
  fVar289 = fVar360 + fVar371 + fVar228;
  fVar305 = fVar369 + fVar287 + fVar188;
  fVar311 = fVar372 + fVar288 + fVar229;
  fVar316 = fVar374 + fVar368 + fVar253;
  fVar413 = (fVar303 * 3.0 + fVar371) - fVar228 * 3.0;
  fVar414 = (fVar399 * 3.0 + fVar287) - fVar188 * 3.0;
  fVar420 = (fVar420 * 3.0 + fVar288) - fVar229 * 3.0;
  fVar421 = (fVar421 * 3.0 + fVar368) - fVar253 * 3.0;
  fVar368 = fVar352 + fVar216 + fVar344 + fVar117 * 0.0;
  fVar230 = fVar230 + fVar217 + fVar353 + fVar146 * 0.0;
  fVar303 = fVar231 + fVar218 + fVar355 + fVar189 * 0.0;
  fVar399 = fVar320 + fVar227 + fVar357 + fVar214 * 0.0;
  fVar287 = ((fVar216 * 3.0 - fVar339 * 3.0) + fVar344) - fVar117 * 0.0;
  fVar288 = ((fVar217 * 3.0 - fVar390 * 3.0) + fVar353) - fVar146 * 0.0;
  fVar352 = ((fVar218 * 3.0 - fVar403 * 3.0) + fVar355) - fVar189 * 0.0;
  fVar231 = ((fVar227 * 3.0 - fVar411 * 3.0) + fVar357) - fVar214 * 0.0;
  fVar189 = fVar345 + fVar264 + fVar360 + fVar228 * 0.0;
  fVar214 = fVar354 + fVar265 + fVar369 + fVar188 * 0.0;
  fVar216 = fVar356 + fVar359 + fVar372 + fVar229 * 0.0;
  fVar217 = fVar358 + fVar267 + fVar374 + fVar253 * 0.0;
  fVar371 = ((fVar264 * 3.0 - fVar422 * 3.0) + fVar360) - fVar228 * 0.0;
  fVar117 = ((fVar265 * 3.0 - fVar304 * 3.0) + fVar369) - fVar188 * 0.0;
  fVar146 = ((fVar359 * 3.0 - fVar310 * 3.0) + fVar372) - fVar229 * 0.0;
  fVar264 = ((fVar267 * 3.0 - fVar315 * 3.0) + fVar374) - fVar253 * 0.0;
  fVar310 = fVar336 * fVar289 - fVar305 * fVar309;
  fVar315 = fVar376 * fVar305 - fVar311 * fVar336;
  fVar311 = fVar309 * fVar311 - fVar289 * fVar376;
  fVar316 = fVar387 * fVar316 - fVar316 * fVar387;
  fVar339 = fVar336 * fVar413 - fVar414 * fVar309;
  fVar289 = fVar376 * fVar414 - fVar420 * fVar336;
  fVar420 = fVar309 * fVar420 - fVar413 * fVar376;
  fVar411 = fVar288 * fVar189 - fVar214 * fVar287;
  fVar413 = fVar352 * fVar214 - fVar216 * fVar288;
  fVar414 = fVar287 * fVar216 - fVar189 * fVar352;
  fVar422 = fVar231 * fVar217 - fVar217 * fVar231;
  fVar359 = fVar288 * fVar371 - fVar117 * fVar287;
  fVar267 = fVar352 * fVar117 - fVar146 * fVar288;
  fVar403 = fVar287 * fVar146 - fVar371 * fVar352;
  fVar253 = fVar311 * fVar311 + fVar315 * fVar315 + fVar310 * fVar310;
  auVar192 = ZEXT416((uint)fVar253);
  auVar233 = rsqrtss(ZEXT416((uint)fVar253),auVar192);
  fVar371 = auVar233._0_4_;
  fVar304 = fVar371 * 1.5 - fVar371 * fVar371 * fVar253 * 0.5 * fVar371;
  fVar344 = fVar310 * fVar339 + fVar311 * fVar420 + fVar315 * fVar289;
  fVar320 = fVar316 * fVar304;
  auVar192 = rcpss(auVar192,auVar192);
  fVar390 = (2.0 - fVar253 * auVar192._0_4_) * auVar192._0_4_;
  fVar305 = fVar414 * fVar414 + fVar413 * fVar413 + fVar411 * fVar411;
  auVar233 = ZEXT416((uint)fVar305);
  auVar192 = rsqrtss(ZEXT416((uint)fVar305),auVar233);
  fVar371 = auVar192._0_4_;
  fVar345 = fVar371 * 1.5 - fVar371 * fVar371 * fVar305 * 0.5 * fVar371;
  fVar353 = fVar411 * fVar359 + fVar414 * fVar403 + fVar413 * fVar267;
  lVar23 = *(long *)(_Var21 + 0x38 + lVar107);
  lVar25 = *(long *)(_Var21 + 0x48 + lVar107);
  pfVar1 = (float *)(lVar23 + lVar25 * uVar104);
  fVar371 = *pfVar1;
  fVar117 = pfVar1[1];
  fVar146 = pfVar1[2];
  fVar189 = pfVar1[3];
  pfVar1 = (float *)(lVar23 + lVar25 * lVar110);
  fVar214 = *pfVar1;
  fVar216 = pfVar1[1];
  fVar217 = pfVar1[2];
  fVar218 = pfVar1[3];
  lVar23 = *(long *)(lVar22 + 0x38 + lVar107);
  lVar22 = *(long *)(lVar22 + 0x48 + lVar107);
  pfVar1 = (float *)(lVar23 + lVar22 * lVar110);
  fVar227 = *pfVar1;
  fVar228 = pfVar1[1];
  fVar188 = pfVar1[2];
  fVar229 = pfVar1[3];
  lVar25 = *(long *)(_Var24 + 0x38 + lVar107);
  lVar26 = *(long *)(_Var24 + 0x48 + lVar107);
  uVar105 = uVar104 * lVar26;
  auVar192 = rcpss(auVar233,auVar233);
  pfVar1 = (float *)(lVar25 + lVar26 * lVar110);
  fVar265 = fVar422 * fVar345;
  fVar354 = (2.0 - fVar305 * auVar192._0_4_) * auVar192._0_4_;
  fVar391 = fVar412 * fVar315 * fVar304;
  fVar400 = fVar412 * fVar311 * fVar304;
  fVar402 = fVar412 * fVar310 * fVar304;
  fVar404 = fVar412 * fVar320;
  fVar372 = fVar385 - fVar391;
  fVar306 = fVar401 - fVar400;
  fVar312 = fVar405 - fVar402;
  fVar317 = fVar412 - fVar404;
  fVar377 = fVar412 * fVar390 * (fVar253 * fVar289 - fVar344 * fVar315) * fVar304 +
            fVar387 * fVar315 * fVar304;
  fVar386 = fVar412 * fVar390 * (fVar253 * fVar420 - fVar344 * fVar311) * fVar304 +
            fVar387 * fVar311 * fVar304;
  fVar388 = fVar412 * fVar390 * (fVar253 * fVar339 - fVar344 * fVar310) * fVar304 +
            fVar387 * fVar310 * fVar304;
  fVar389 = fVar412 * fVar390 * (fVar253 * (fVar387 * fVar421 - fVar421 * fVar387) -
                                fVar344 * fVar316) * fVar304 + fVar387 * fVar320;
  fVar391 = fVar391 + fVar385;
  fVar400 = fVar400 + fVar401;
  fVar402 = fVar402 + fVar405;
  fVar404 = fVar404 + fVar412;
  fVar320 = fVar399 * fVar413 * fVar345;
  fVar339 = fVar399 * fVar414 * fVar345;
  fVar385 = fVar399 * fVar411 * fVar345;
  fVar390 = fVar399 * fVar265;
  pfVar2 = (float *)(*(long *)(p_Var106 + lVar107 + 0x38) +
                    *(long *)(p_Var106 + lVar107 + 0x48) * lVar110);
  fVar321 = fVar368 - fVar320;
  fVar337 = fVar230 - fVar339;
  fVar340 = fVar303 - fVar385;
  fVar342 = fVar399 - fVar390;
  fVar420 = fVar399 * fVar354 * (fVar305 * fVar267 - fVar353 * fVar413) * fVar345 +
            fVar231 * fVar413 * fVar345;
  fVar289 = fVar399 * fVar354 * (fVar305 * fVar403 - fVar353 * fVar414) * fVar345 +
            fVar231 * fVar414 * fVar345;
  fVar310 = fVar399 * fVar354 * (fVar305 * fVar359 - fVar353 * fVar411) * fVar345 +
            fVar231 * fVar411 * fVar345;
  fVar316 = fVar399 * fVar354 * (fVar305 * (fVar231 * fVar264 - fVar264 * fVar231) -
                                fVar353 * fVar422) * fVar345 + fVar231 * fVar265;
  fVar320 = fVar320 + fVar368;
  fVar339 = fVar339 + fVar230;
  fVar385 = fVar385 + fVar303;
  fVar390 = fVar390 + fVar399;
  fVar399 = fVar214 - *pfVar2 * 0.33333334;
  fVar403 = fVar216 - pfVar2[1] * 0.33333334;
  fVar411 = fVar217 - pfVar2[2] * 0.33333334;
  fVar413 = fVar218 - pfVar2[3] * 0.33333334;
  fVar353 = fVar227 - *pfVar1 * 0.33333334;
  fVar355 = fVar228 - pfVar1[1] * 0.33333334;
  fVar357 = fVar188 - pfVar1[2] * 0.33333334;
  fVar360 = fVar229 - pfVar1[3] * 0.33333334;
  fVar267 = fVar399 * 0.0;
  fVar368 = fVar403 * 0.0;
  fVar230 = fVar411 * 0.0;
  fVar303 = fVar413 * 0.0;
  fVar374 = fVar214 * 0.0 + fVar267;
  fVar307 = fVar216 * 0.0 + fVar368;
  fVar313 = fVar217 * 0.0 + fVar230;
  fVar318 = fVar218 * 0.0 + fVar303;
  pfVar1 = (float *)(*(long *)(p_Var106 + lVar107 + 0x38) +
                    *(long *)(p_Var106 + lVar107 + 0x48) * uVar104);
  fVar253 = *pfVar1 * 0.33333334 + fVar371;
  fVar264 = pfVar1[1] * 0.33333334 + fVar117;
  fVar265 = pfVar1[2] * 0.33333334 + fVar146;
  fVar359 = pfVar1[3] * 0.33333334 + fVar189;
  fVar421 = fVar253 * 0.0;
  fVar304 = fVar264 * 0.0;
  fVar311 = fVar265 * 0.0;
  fVar344 = fVar359 * 0.0;
  fVar401 = (fVar253 * 3.0 + fVar374) - fVar371 * 3.0;
  fVar405 = (fVar264 * 3.0 + fVar307) - fVar117 * 3.0;
  fVar412 = (fVar265 * 3.0 + fVar313) - fVar146 * 3.0;
  fVar414 = (fVar359 * 3.0 + fVar318) - fVar189 * 3.0;
  fVar322 = fVar353 * 0.0;
  fVar338 = fVar355 * 0.0;
  fVar341 = fVar357 * 0.0;
  fVar343 = fVar360 * 0.0;
  fVar290 = fVar227 * 0.0 + fVar322;
  fVar308 = fVar228 * 0.0 + fVar338;
  fVar314 = fVar188 * 0.0 + fVar341;
  fVar319 = fVar229 * 0.0 + fVar343;
  pfVar1 = (float *)(lVar25 + uVar105);
  pfVar2 = (float *)(lVar23 + lVar22 * uVar104);
  fVar253 = *pfVar2;
  fVar264 = pfVar2[1];
  fVar265 = pfVar2[2];
  fVar359 = pfVar2[3];
  fVar422 = *pfVar1 * 0.33333334 + fVar253;
  fVar305 = pfVar1[1] * 0.33333334 + fVar264;
  fVar315 = pfVar1[2] * 0.33333334 + fVar265;
  fVar345 = pfVar1[3] * 0.33333334 + fVar359;
  fVar361 = fVar422 * 0.0;
  fVar370 = fVar305 * 0.0;
  fVar373 = fVar315 * 0.0;
  fVar375 = fVar345 * 0.0;
  fVar354 = (fVar422 * 3.0 + fVar290) - fVar253 * 3.0;
  fVar356 = (fVar305 * 3.0 + fVar308) - fVar264 * 3.0;
  fVar358 = (fVar315 * 3.0 + fVar314) - fVar265 * 3.0;
  fVar369 = (fVar345 * 3.0 + fVar319) - fVar359 * 3.0;
  fVar422 = fVar421 + fVar374 + fVar371;
  fVar305 = fVar304 + fVar307 + fVar117;
  fVar315 = fVar311 + fVar313 + fVar146;
  fVar345 = fVar344 + fVar318 + fVar189;
  fVar267 = fVar267 + fVar214 + fVar421 + fVar371 * 0.0;
  fVar368 = fVar368 + fVar216 + fVar304 + fVar117 * 0.0;
  fVar230 = fVar230 + fVar217 + fVar311 + fVar146 * 0.0;
  fVar303 = fVar303 + fVar218 + fVar344 + fVar189 * 0.0;
  fVar371 = ((fVar214 * 3.0 - fVar399 * 3.0) + fVar421) - fVar371 * 0.0;
  fVar117 = ((fVar216 * 3.0 - fVar403 * 3.0) + fVar304) - fVar117 * 0.0;
  fVar146 = ((fVar217 * 3.0 - fVar411 * 3.0) + fVar311) - fVar146 * 0.0;
  fVar189 = ((fVar218 * 3.0 - fVar413 * 3.0) + fVar344) - fVar189 * 0.0;
  fVar218 = fVar361 + fVar290 + fVar253;
  fVar421 = fVar370 + fVar308 + fVar264;
  fVar311 = fVar373 + fVar314 + fVar265;
  fVar374 = fVar375 + fVar319 + fVar359;
  fVar399 = fVar322 + fVar227 + fVar361 + fVar253 * 0.0;
  fVar403 = fVar338 + fVar228 + fVar370 + fVar264 * 0.0;
  fVar413 = fVar341 + fVar188 + fVar373 + fVar265 * 0.0;
  fVar304 = fVar343 + fVar229 + fVar375 + fVar359 * 0.0;
  fVar214 = ((fVar227 * 3.0 - fVar353 * 3.0) + fVar361) - fVar253 * 0.0;
  fVar216 = ((fVar228 * 3.0 - fVar355 * 3.0) + fVar370) - fVar264 * 0.0;
  fVar217 = ((fVar188 * 3.0 - fVar357 * 3.0) + fVar373) - fVar265 * 0.0;
  fVar411 = ((fVar229 * 3.0 - fVar360 * 3.0) + fVar375) - fVar359 * 0.0;
  fVar264 = fVar405 * fVar218 - fVar421 * fVar401;
  fVar265 = fVar412 * fVar421 - fVar311 * fVar405;
  fVar344 = fVar401 * fVar311 - fVar218 * fVar412;
  fVar360 = fVar414 * fVar374 - fVar374 * fVar414;
  fVar218 = fVar405 * fVar354 - fVar356 * fVar401;
  fVar228 = fVar412 * fVar356 - fVar358 * fVar405;
  fVar229 = fVar401 * fVar358 - fVar354 * fVar412;
  fVar421 = fVar117 * fVar399 - fVar403 * fVar371;
  fVar311 = fVar146 * fVar403 - fVar413 * fVar117;
  fVar353 = fVar371 * fVar413 - fVar399 * fVar146;
  fVar355 = fVar189 * fVar304 - fVar304 * fVar189;
  fVar227 = fVar117 * fVar214 - fVar216 * fVar371;
  fVar188 = fVar146 * fVar216 - fVar217 * fVar117;
  fVar253 = fVar371 * fVar217 - fVar214 * fVar146;
  fVar214 = fVar344 * fVar344 + fVar265 * fVar265 + fVar264 * fVar264;
  auVar192 = ZEXT416((uint)fVar214);
  auVar233 = rsqrtss(ZEXT416((uint)fVar214),auVar192);
  fVar216 = auVar233._0_4_;
  fVar304 = fVar216 * 1.5 - fVar216 * fVar216 * fVar214 * 0.5 * fVar216;
  fVar354 = fVar264 * fVar218 + fVar344 * fVar229 + fVar265 * fVar228;
  auVar192 = rcpss(auVar192,auVar192);
  fVar216 = (2.0 - fVar214 * auVar192._0_4_) * auVar192._0_4_;
  fVar217 = fVar360 * fVar304;
  fVar357 = fVar353 * fVar353 + fVar311 * fVar311 + fVar421 * fVar421;
  auVar192 = ZEXT416((uint)fVar357);
  auVar233 = rsqrtss(ZEXT416((uint)fVar357),auVar192);
  fVar359 = auVar233._0_4_;
  fVar374 = fVar359 * 1.5 - fVar359 * fVar359 * fVar357 * 0.5 * fVar359;
  fVar290 = fVar421 * fVar227 + fVar353 * fVar253 + fVar311 * fVar188;
  auVar192 = rcpss(auVar192,auVar192);
  fVar307 = (2.0 - fVar357 * auVar192._0_4_) * auVar192._0_4_;
  fVar358 = fVar355 * fVar374;
  fVar359 = fVar345 * fVar265 * fVar304;
  fVar399 = fVar345 * fVar344 * fVar304;
  fVar403 = fVar345 * fVar264 * fVar304;
  fVar413 = fVar345 * fVar217;
  fVar228 = fVar345 * fVar216 * (fVar214 * fVar228 - fVar354 * fVar265) * fVar304 +
            fVar414 * fVar265 * fVar304;
  fVar229 = fVar345 * fVar216 * (fVar214 * fVar229 - fVar354 * fVar344) * fVar304 +
            fVar414 * fVar344 * fVar304;
  fVar264 = fVar345 * fVar216 * (fVar214 * fVar218 - fVar354 * fVar264) * fVar304 +
            fVar414 * fVar264 * fVar304;
  fVar265 = fVar345 * fVar216 * (fVar214 * (fVar414 * fVar369 - fVar369 * fVar414) -
                                fVar354 * fVar360) * fVar304 + fVar414 * fVar217;
  fVar304 = fVar422 - fVar359;
  fVar344 = fVar305 - fVar399;
  fVar354 = fVar315 - fVar403;
  fVar356 = fVar345 - fVar413;
  fVar359 = fVar359 + fVar422;
  fVar399 = fVar399 + fVar305;
  fVar403 = fVar403 + fVar315;
  fVar413 = fVar413 + fVar345;
  fVar214 = fVar303 * fVar311 * fVar374;
  fVar216 = fVar303 * fVar353 * fVar374;
  fVar217 = fVar303 * fVar421 * fVar374;
  fVar218 = fVar303 * fVar358;
  fVar422 = fVar303 * fVar307 * (fVar357 * fVar188 - fVar290 * fVar311) * fVar374 +
            fVar189 * fVar311 * fVar374;
  fVar305 = fVar303 * fVar307 * (fVar357 * fVar253 - fVar290 * fVar353) * fVar374 +
            fVar189 * fVar353 * fVar374;
  fVar421 = fVar303 * fVar307 * (fVar357 * fVar227 - fVar290 * fVar421) * fVar374 +
            fVar189 * fVar421 * fVar374;
  fVar311 = fVar303 * fVar307 * (fVar357 * (fVar189 * fVar411 - fVar411 * fVar189) -
                                fVar290 * fVar355) * fVar374 + fVar189 * fVar358;
  fVar227 = fVar267 - fVar214;
  fVar188 = fVar368 - fVar216;
  fVar253 = fVar230 - fVar217;
  fVar411 = fVar303 - fVar218;
  fVar214 = fVar214 + fVar267;
  fVar216 = fVar216 + fVar368;
  fVar217 = fVar217 + fVar230;
  fVar218 = fVar218 + fVar303;
  fVar267 = 1.0 - fVar145;
  local_378 = fVar372 * fVar267 + fVar304 * fVar145;
  fStack_374 = fVar306 * fVar267 + fVar344 * fVar145;
  fStack_370 = fVar312 * fVar267 + fVar354 * fVar145;
  fStack_36c = fVar317 * fVar267 + fVar356 * fVar145;
  local_388 = ((fVar309 - fVar377) * 0.33333334 + fVar372) * fVar267 +
              ((fVar401 - fVar228) * 0.33333334 + fVar304) * fVar145;
  fStack_384 = ((fVar336 - fVar386) * 0.33333334 + fVar306) * fVar267 +
               ((fVar405 - fVar229) * 0.33333334 + fVar344) * fVar145;
  fStack_380 = ((fVar376 - fVar388) * 0.33333334 + fVar312) * fVar267 +
               ((fVar412 - fVar264) * 0.33333334 + fVar354) * fVar145;
  fStack_37c = ((fVar387 - fVar389) * 0.33333334 + fVar317) * fVar267 +
               ((fVar414 - fVar265) * 0.33333334 + fVar356) * fVar145;
  local_3a8 = (fVar321 - (fVar287 - fVar420) * 0.33333334) * fVar267 +
              (fVar227 - (fVar371 - fVar422) * 0.33333334) * fVar145;
  fStack_3a4 = (fVar337 - (fVar288 - fVar289) * 0.33333334) * fVar267 +
               (fVar188 - (fVar117 - fVar305) * 0.33333334) * fVar145;
  fStack_3a0 = (fVar340 - (fVar352 - fVar310) * 0.33333334) * fVar267 +
               (fVar253 - (fVar146 - fVar421) * 0.33333334) * fVar145;
  fStack_39c = (fVar342 - (fVar231 - fVar316) * 0.33333334) * fVar267 +
               (fVar411 - (fVar189 - fVar311) * 0.33333334) * fVar145;
  local_398 = fVar321 * fVar267 + fVar227 * fVar145;
  fStack_394 = fVar337 * fVar267 + fVar188 * fVar145;
  fStack_390 = fVar340 * fVar267 + fVar253 * fVar145;
  fStack_38c = fVar342 * fVar267 + fVar411 * fVar145;
  local_368 = fVar391 * fVar267 + fVar359 * fVar145;
  fStack_364 = fVar400 * fVar267 + fVar399 * fVar145;
  fStack_360 = fVar402 * fVar267 + fVar403 * fVar145;
  fStack_35c = fVar404 * fVar267 + fVar413 * fVar145;
  local_358 = ((fVar377 + fVar309) * 0.33333334 + fVar391) * fVar267 +
              ((fVar228 + fVar401) * 0.33333334 + fVar359) * fVar145;
  fStack_354 = ((fVar386 + fVar336) * 0.33333334 + fVar400) * fVar267 +
               ((fVar229 + fVar405) * 0.33333334 + fVar399) * fVar145;
  fStack_350 = ((fVar388 + fVar376) * 0.33333334 + fVar402) * fVar267 +
               ((fVar264 + fVar412) * 0.33333334 + fVar403) * fVar145;
  fStack_34c = ((fVar389 + fVar387) * 0.33333334 + fVar404) * fVar267 +
               ((fVar265 + fVar414) * 0.33333334 + fVar413) * fVar145;
  local_3c8 = (fVar320 - (fVar420 + fVar287) * 0.33333334) * fVar267 +
              (fVar214 - (fVar422 + fVar371) * 0.33333334) * fVar145;
  fStack_3c4 = (fVar339 - (fVar289 + fVar288) * 0.33333334) * fVar267 +
               (fVar216 - (fVar305 + fVar117) * 0.33333334) * fVar145;
  fStack_3c0 = (fVar385 - (fVar310 + fVar352) * 0.33333334) * fVar267 +
               (fVar217 - (fVar421 + fVar146) * 0.33333334) * fVar145;
  fStack_3bc = (fVar390 - (fVar316 + fVar231) * 0.33333334) * fVar267 +
               (fVar218 - (fVar311 + fVar189) * 0.33333334) * fVar145;
  local_218 = fVar267 * fVar320 + fVar145 * fVar214;
  fStack_214 = fVar267 * fVar339 + fVar145 * fVar216;
  fStack_210 = fVar267 * fVar385 + fVar145 * fVar217;
  fStack_20c = fVar267 * fVar390 + fVar145 * fVar218;
  fVar371 = (ray->org).field_0.m128[0];
  fVar117 = (ray->org).field_0.m128[1];
  fVar145 = (ray->org).field_0.m128[2];
  fVar146 = (pre->ray_space).vx.field_0.m128[0];
  fVar189 = (pre->ray_space).vx.field_0.m128[1];
  fVar214 = (pre->ray_space).vy.field_0.m128[0];
  fVar216 = (pre->ray_space).vy.field_0.m128[1];
  fVar217 = (pre->ray_space).vz.field_0.m128[0];
  fVar218 = (pre->ray_space).vz.field_0.m128[1];
  fVar188 = (local_378 - fVar371) * fVar146 +
            (fStack_374 - fVar117) * fVar214 + (fStack_370 - fVar145) * fVar217;
  fVar229 = (local_378 - fVar371) * fVar189 +
            (fStack_374 - fVar117) * fVar216 + (fStack_370 - fVar145) * fVar218;
  local_328._0_8_ = CONCAT44(fVar229,fVar188);
  fVar227 = (local_388 - fVar371) * fVar146 +
            (fStack_384 - fVar117) * fVar214 + (fStack_380 - fVar145) * fVar217;
  fVar228 = (local_388 - fVar371) * fVar189 +
            (fStack_384 - fVar117) * fVar216 + (fStack_380 - fVar145) * fVar218;
  local_338._0_8_ = CONCAT44(fVar228,fVar227);
  local_3b8 = (local_3a8 - fVar371) * fVar146 +
              (fStack_3a4 - fVar117) * fVar214 + (fStack_3a0 - fVar145) * fVar217;
  fStack_3b4 = (local_3a8 - fVar371) * fVar189 +
               (fStack_3a4 - fVar117) * fVar216 + (fStack_3a0 - fVar145) * fVar218;
  fVar265 = (local_398 - fVar371) * fVar146 +
            (fStack_394 - fVar117) * fVar214 + (fStack_390 - fVar145) * fVar217;
  fVar359 = (local_398 - fVar371) * fVar189 +
            (fStack_394 - fVar117) * fVar216 + (fStack_390 - fVar145) * fVar218;
  local_2d8 = CONCAT44(fVar359,fVar265);
  local_2e8 = (local_368 - fVar371) * fVar146 +
              (fStack_364 - fVar117) * fVar214 + (fStack_360 - fVar145) * fVar217;
  fStack_2e4 = (local_368 - fVar371) * fVar189 +
               (fStack_364 - fVar117) * fVar216 + (fStack_360 - fVar145) * fVar218;
  fVar253 = (local_358 - fVar371) * fVar146 +
            (fStack_354 - fVar117) * fVar214 + (fStack_350 - fVar145) * fVar217;
  fVar264 = (local_358 - fVar371) * fVar189 +
            (fStack_354 - fVar117) * fVar216 + (fStack_350 - fVar145) * fVar218;
  uStack_2b0 = CONCAT44(fVar264,fVar253);
  local_308 = (local_3c8 - fVar371) * fVar146 +
              (fStack_3c4 - fVar117) * fVar214 + (fStack_3c0 - fVar145) * fVar217;
  fStack_304 = (local_3c8 - fVar371) * fVar189 +
               (fStack_3c4 - fVar117) * fVar216 + (fStack_3c0 - fVar145) * fVar218;
  fVar146 = (local_218 - fVar371) * fVar146 +
            (fStack_214 - fVar117) * fVar214 + (fStack_210 - fVar145) * fVar217;
  fVar371 = (local_218 - fVar371) * fVar189 +
            (fStack_214 - fVar117) * fVar216 + (fStack_210 - fVar145) * fVar218;
  local_318 = CONCAT44(fVar371,fVar146);
  auVar363._8_8_ = uStack_2b0;
  auVar363._0_8_ = local_338._0_8_;
  local_2c8 = CONCAT44(fStack_3b4,local_3b8);
  local_b8._8_8_ = local_318;
  local_b8._0_8_ = local_2d8;
  auVar130._8_4_ = local_2e8;
  auVar130._0_8_ = local_328._0_8_;
  auVar130._12_4_ = fStack_2e4;
  auVar192 = minps(auVar130,auVar363);
  auVar169._8_4_ = local_308;
  auVar169._0_8_ = local_2c8;
  auVar169._12_4_ = fStack_304;
  auVar233 = minps(auVar169,local_b8);
  auVar192 = minps(auVar192,auVar233);
  auVar170._4_4_ = fVar229;
  auVar170._0_4_ = fVar188;
  auVar170._8_4_ = local_2e8;
  auVar170._12_4_ = fStack_2e4;
  auVar233 = maxps(auVar170,auVar363);
  auVar203._8_4_ = local_308;
  auVar203._0_8_ = local_2c8;
  auVar203._12_4_ = fStack_304;
  auVar204 = maxps(auVar203,local_b8);
  auVar171 = maxps(auVar233,auVar204);
  auVar29._4_8_ = auVar204._8_8_;
  auVar29._0_4_ = auVar192._4_4_;
  auVar205._0_8_ = auVar29._0_8_ << 0x20;
  auVar205._8_4_ = auVar192._8_4_;
  auVar205._12_4_ = auVar192._12_4_;
  auVar206._8_8_ = auVar192._8_8_;
  auVar206._0_8_ = auVar205._8_8_;
  auVar233 = minps(auVar192,auVar206);
  auVar30._4_8_ = auVar192._8_8_;
  auVar30._0_4_ = auVar171._4_4_;
  auVar207._0_8_ = auVar30._0_8_ << 0x20;
  auVar207._8_4_ = auVar171._8_4_;
  auVar207._12_4_ = auVar171._12_4_;
  auVar208._8_8_ = auVar171._8_8_;
  auVar208._0_8_ = auVar207._8_8_;
  auVar192 = maxps(auVar171,auVar208);
  auVar131._0_8_ = auVar233._0_8_ & 0x7fffffff7fffffff;
  auVar131._8_4_ = auVar233._8_4_ & 0x7fffffff;
  auVar131._12_4_ = auVar233._12_4_ & 0x7fffffff;
  auVar172._0_8_ = auVar192._0_8_ & 0x7fffffff7fffffff;
  auVar172._8_4_ = auVar192._8_4_ & 0x7fffffff;
  auVar172._12_4_ = auVar192._12_4_ & 0x7fffffff;
  auVar192 = maxps(auVar131,auVar172);
  fStack_c4 = auVar192._4_4_;
  local_c8 = fStack_c4;
  if (fStack_c4 <= auVar192._0_4_) {
    local_c8 = auVar192._0_4_;
  }
  local_c8 = local_c8 * 9.536743e-07;
  local_328._8_8_ = local_328._0_8_;
  local_338._8_8_ = local_338._0_8_;
  register0x00001588 = local_2d8;
  register0x00001288 = uStack_2b0;
  local_2f8 = uStack_2b0;
  register0x00001348 = local_318;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  _local_298 = CONCAT44(fStack_2e4,local_2e8);
  local_88 = fVar227 - fVar188;
  fStack_84 = fVar228 - fVar229;
  fStack_80 = fVar253 - local_2e8;
  fStack_7c = fVar264 - fStack_2e4;
  local_98 = local_3b8 - fVar227;
  fStack_94 = fStack_3b4 - fVar228;
  fStack_90 = local_308 - fVar253;
  fStack_8c = fStack_304 - fVar264;
  fStack_2b4 = fStack_304;
  local_2b8 = local_308;
  local_a8 = fVar265 - local_3b8;
  fStack_a4 = fVar359 - fStack_3b4;
  fStack_a0 = fVar146 - local_308;
  fStack_9c = fVar371 - fStack_304;
  local_198 = local_368 - local_378;
  fStack_194 = fStack_364 - fStack_374;
  fStack_190 = fStack_360 - fStack_370;
  fStack_18c = fStack_35c - fStack_36c;
  local_1a8 = local_358 - local_388;
  fStack_1a4 = fStack_354 - fStack_384;
  fStack_1a0 = fStack_350 - fStack_380;
  fStack_19c = fStack_34c - fStack_37c;
  local_1b8 = local_3c8 - local_3a8;
  fStack_1b4 = fStack_3c4 - fStack_3a4;
  fStack_1b0 = fStack_3c0 - fStack_3a0;
  fStack_1ac = fStack_3bc - fStack_39c;
  local_1c8 = local_218 - local_398;
  fStack_1c4 = fStack_214 - fStack_394;
  fStack_1c0 = fStack_210 - fStack_390;
  fStack_1bc = fStack_20c - fStack_38c;
  bVar111 = 0;
  uVar104 = 0;
  local_418._0_4_ = 0.0;
  local_418._4_4_ = 1.0;
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  fVar371 = 0.0;
  fVar117 = 1.0;
  local_158 = local_c8;
  fStack_154 = local_c8;
  fStack_150 = local_c8;
  fStack_14c = local_c8;
  local_168 = -local_c8;
  fStack_164 = -local_c8;
  fStack_160 = -local_c8;
  fStack_15c = -local_c8;
  fStack_3b0 = local_3b8;
  fStack_3ac = fStack_3b4;
  fStack_300 = local_308;
  fStack_2fc = fStack_304;
  fStack_2e0 = local_2e8;
  fStack_2dc = fStack_2e4;
  local_2a8 = local_328._0_8_;
LAB_003af18c:
  fVar145 = 1.0 - (float)local_418._0_4_;
  fVar146 = 1.0 - (float)local_418._0_4_;
  fVar189 = 1.0 - (float)local_418._4_4_;
  fVar214 = 1.0 - (float)local_418._4_4_;
  fVar267 = local_328._0_4_ * fVar145 + local_2e8 * (float)local_418._0_4_;
  fVar231 = local_328._4_4_ * fVar146 + fStack_2e4 * (float)local_418._0_4_;
  fVar303 = local_328._8_4_ * fVar189 + fStack_2e0 * (float)local_418._4_4_;
  fVar336 = local_328._12_4_ * fVar214 + fStack_2dc * (float)local_418._4_4_;
  fVar218 = local_338._0_4_ * fVar145 + local_2f8._0_4_ * (float)local_418._0_4_;
  fVar368 = local_338._4_4_ * fVar146 + local_2f8._4_4_ * (float)local_418._0_4_;
  fVar352 = local_338._8_4_ * fVar189 + local_2f8._8_4_ * (float)local_418._4_4_;
  fVar230 = local_338._12_4_ * fVar214 + local_2f8._12_4_ * (float)local_418._4_4_;
  fVar401 = local_3b8 * fVar145 + local_308 * (float)local_418._0_4_;
  fVar403 = fStack_3b4 * fVar146 + fStack_304 * (float)local_418._0_4_;
  fVar405 = fStack_3b0 * fVar189 + fStack_300 * (float)local_418._4_4_;
  fVar411 = fStack_3ac * fVar214 + fStack_2fc * (float)local_418._4_4_;
  fVar309 = fVar145 * local_2d8._0_4_ + (float)local_418._0_4_ * local_318._0_4_;
  fVar320 = fVar146 * local_2d8._4_4_ + (float)local_418._0_4_ * local_318._4_4_;
  fVar339 = fVar189 * local_2d8._8_4_ + (float)local_418._4_4_ * local_318._8_4_;
  fVar376 = fVar214 * local_2d8._12_4_ + (float)local_418._4_4_ * local_318._12_4_;
  fVar385 = (fVar117 - fVar371) * 0.11111111;
  local_408 = CONCAT44(fVar117,fVar371);
  fVar387 = (fVar117 - fVar371) * 0.0 + fVar371;
  fVar390 = (fVar117 - fVar371) * 0.33333334 + fVar371;
  fVar399 = (fVar117 - fVar371) * 0.6666667 + fVar371;
  fVar371 = (fVar117 - fVar371) * 1.0 + fVar371;
  fVar117 = 1.0 - fVar387;
  fVar145 = 1.0 - fVar390;
  fVar146 = 1.0 - fVar399;
  fVar217 = 1.0 - fVar371;
  fVar227 = fVar218 * fVar117 + fVar401 * fVar387;
  fVar228 = fVar218 * fVar145 + fVar401 * fVar390;
  fVar188 = fVar218 * fVar146 + fVar401 * fVar399;
  fVar229 = fVar218 * fVar217 + fVar401 * fVar371;
  fVar253 = fVar368 * fVar117 + fVar403 * fVar387;
  fVar264 = fVar368 * fVar145 + fVar403 * fVar390;
  fVar265 = fVar368 * fVar146 + fVar403 * fVar399;
  fVar359 = fVar368 * fVar217 + fVar403 * fVar371;
  fVar189 = (fVar267 * fVar117 + fVar218 * fVar387) * fVar117 + fVar387 * fVar227;
  fVar214 = (fVar267 * fVar145 + fVar218 * fVar390) * fVar145 + fVar390 * fVar228;
  fVar216 = (fVar267 * fVar146 + fVar218 * fVar399) * fVar146 + fVar399 * fVar188;
  fVar218 = (fVar267 * fVar217 + fVar218 * fVar371) * fVar217 + fVar371 * fVar229;
  fVar267 = (fVar231 * fVar117 + fVar368 * fVar387) * fVar117 + fVar387 * fVar253;
  fVar287 = (fVar231 * fVar145 + fVar368 * fVar390) * fVar145 + fVar390 * fVar264;
  fVar288 = (fVar231 * fVar146 + fVar368 * fVar399) * fVar146 + fVar399 * fVar265;
  fVar368 = (fVar231 * fVar217 + fVar368 * fVar371) * fVar217 + fVar371 * fVar359;
  fVar227 = fVar227 * fVar117 + (fVar401 * fVar117 + fVar309 * fVar387) * fVar387;
  fVar228 = fVar228 * fVar145 + (fVar401 * fVar145 + fVar309 * fVar390) * fVar390;
  fVar188 = fVar188 * fVar146 + (fVar401 * fVar146 + fVar309 * fVar399) * fVar399;
  fVar229 = fVar229 * fVar217 + (fVar401 * fVar217 + fVar309 * fVar371) * fVar371;
  fVar253 = fVar253 * fVar117 + (fVar403 * fVar117 + fVar320 * fVar387) * fVar387;
  fVar264 = fVar264 * fVar145 + (fVar403 * fVar145 + fVar320 * fVar390) * fVar390;
  fVar265 = fVar265 * fVar146 + (fVar403 * fVar146 + fVar320 * fVar399) * fVar399;
  fVar359 = fVar359 * fVar217 + (fVar403 * fVar217 + fVar320 * fVar371) * fVar371;
  local_258 = fVar117 * fVar189 + fVar387 * fVar227;
  fStack_254 = fVar145 * fVar214 + fVar390 * fVar228;
  fStack_250 = fVar146 * fVar216 + fVar399 * fVar188;
  fStack_24c = fVar217 * fVar218 + fVar371 * fVar229;
  local_148 = fVar117 * fVar267 + fVar387 * fVar253;
  fStack_144 = fVar145 * fVar287 + fVar390 * fVar264;
  fStack_140 = fVar146 * fVar288 + fVar399 * fVar265;
  fStack_13c = fVar217 * fVar368 + fVar371 * fVar359;
  fVar214 = (fVar228 - fVar214) * 3.0 * fVar385;
  fVar216 = (fVar188 - fVar216) * 3.0 * fVar385;
  fVar218 = (fVar229 - fVar218) * 3.0 * fVar385;
  fVar228 = (fVar264 - fVar287) * 3.0 * fVar385;
  fVar188 = (fVar265 - fVar288) * 3.0 * fVar385;
  fVar229 = (fVar359 - fVar368) * 3.0 * fVar385;
  local_228._4_4_ = fStack_250;
  local_228._0_4_ = fStack_254;
  local_228._8_4_ = fStack_24c;
  local_228._12_4_ = 0;
  local_e8._4_4_ = fStack_140;
  local_e8._0_4_ = fStack_144;
  local_238 = local_258 + (fVar227 - fVar189) * 3.0 * fVar385;
  fStack_234 = fStack_254 + fVar214;
  fStack_230 = fStack_250 + fVar216;
  fStack_22c = fStack_24c + fVar218;
  local_348._0_4_ = local_148 + (fVar253 - fVar267) * 3.0 * fVar385;
  local_348._4_4_ = fStack_144 + fVar228;
  fStack_340 = fStack_140 + fVar188;
  fStack_33c = fStack_13c + fVar229;
  local_248._0_4_ = fStack_254 - fVar214;
  local_248._4_4_ = fStack_250 - fVar216;
  local_248._8_4_ = fStack_24c - fVar218;
  local_248._12_4_ = 0;
  auVar132._0_4_ = fStack_144 - fVar228;
  auVar132._4_4_ = fStack_140 - fVar188;
  auVar132._8_4_ = fStack_13c - fVar229;
  auVar132._12_4_ = 0;
  fVar189 = fVar352 * fVar117 + fVar405 * fVar387;
  fVar214 = fVar352 * fVar145 + fVar405 * fVar390;
  fVar216 = fVar352 * fVar146 + fVar405 * fVar399;
  fVar218 = fVar352 * fVar217 + fVar405 * fVar371;
  fVar227 = fVar230 * fVar117 + fVar411 * fVar387;
  fVar228 = fVar230 * fVar145 + fVar411 * fVar390;
  fVar188 = fVar230 * fVar146 + fVar411 * fVar399;
  fVar231 = fVar230 * fVar217 + fVar411 * fVar371;
  fVar229 = (fVar303 * fVar117 + fVar352 * fVar387) * fVar117 + fVar387 * fVar189;
  fVar253 = (fVar303 * fVar145 + fVar352 * fVar390) * fVar145 + fVar390 * fVar214;
  fVar264 = (fVar303 * fVar146 + fVar352 * fVar399) * fVar146 + fVar399 * fVar216;
  fVar265 = (fVar303 * fVar217 + fVar352 * fVar371) * fVar217 + fVar371 * fVar218;
  fVar303 = (fVar336 * fVar117 + fVar230 * fVar387) * fVar117 + fVar387 * fVar227;
  fVar309 = (fVar336 * fVar145 + fVar230 * fVar390) * fVar145 + fVar390 * fVar228;
  fVar320 = (fVar336 * fVar146 + fVar230 * fVar399) * fVar146 + fVar399 * fVar188;
  fVar336 = (fVar336 * fVar217 + fVar230 * fVar371) * fVar217 + fVar371 * fVar231;
  fVar359 = fVar189 * fVar117 + (fVar405 * fVar117 + fVar339 * fVar387) * fVar387;
  fVar267 = fVar214 * fVar145 + (fVar405 * fVar145 + fVar339 * fVar390) * fVar390;
  fVar287 = fVar216 * fVar146 + (fVar405 * fVar146 + fVar339 * fVar399) * fVar399;
  fVar288 = fVar218 * fVar217 + (fVar405 * fVar217 + fVar339 * fVar371) * fVar371;
  fVar368 = fVar227 * fVar117 + (fVar411 * fVar117 + fVar376 * fVar387) * fVar387;
  fVar352 = fVar228 * fVar145 + (fVar411 * fVar145 + fVar376 * fVar390) * fVar390;
  fVar230 = fVar188 * fVar146 + (fVar411 * fVar146 + fVar376 * fVar399) * fVar399;
  fVar231 = fVar231 * fVar217 + (fVar411 * fVar217 + fVar376 * fVar371) * fVar371;
  fVar218 = fVar117 * fVar229 + fVar387 * fVar359;
  fVar227 = fVar145 * fVar253 + fVar390 * fVar267;
  fVar228 = fVar146 * fVar264 + fVar399 * fVar287;
  fVar188 = fVar217 * fVar265 + fVar371 * fVar288;
  fVar189 = fVar117 * fVar303 + fVar387 * fVar368;
  fVar214 = fVar145 * fVar309 + fVar390 * fVar352;
  fVar216 = fVar146 * fVar320 + fVar399 * fVar230;
  fVar217 = fVar217 * fVar336 + fVar371 * fVar231;
  fVar371 = (fVar267 - fVar253) * 3.0 * fVar385;
  fVar117 = (fVar287 - fVar264) * 3.0 * fVar385;
  fVar145 = (fVar288 - fVar265) * 3.0 * fVar385;
  fVar146 = (fVar352 - fVar309) * 3.0 * fVar385;
  fVar253 = (fVar230 - fVar320) * 3.0 * fVar385;
  fVar264 = (fVar231 - fVar336) * 3.0 * fVar385;
  local_f8._4_4_ = fVar228;
  local_f8._0_4_ = fVar227;
  local_f8._8_4_ = fVar188;
  local_f8._12_4_ = 0;
  local_118._4_4_ = fVar216;
  local_118._0_4_ = fVar214;
  local_118._8_4_ = fVar217;
  local_118._12_4_ = 0;
  local_138 = fVar218 + (fVar359 - fVar229) * 3.0 * fVar385;
  fStack_134 = fVar227 + fVar371;
  fStack_130 = fVar228 + fVar117;
  fStack_12c = fVar188 + fVar145;
  local_108 = fVar189 + (fVar368 - fVar303) * 3.0 * fVar385;
  fStack_104 = fVar214 + fVar146;
  fStack_100 = fVar216 + fVar253;
  fStack_fc = fVar217 + fVar264;
  local_d8._0_4_ = fVar227 - fVar371;
  local_d8._4_4_ = fVar228 - fVar117;
  local_d8._8_4_ = fVar188 - fVar145;
  local_d8._12_4_ = 0;
  local_128._0_4_ = fVar214 - fVar146;
  local_128._4_4_ = fVar216 - fVar253;
  local_128._8_4_ = fVar217 - fVar264;
  local_128._12_4_ = 0;
  fVar371 = (fVar227 - fStack_254) + (fVar218 - local_258);
  fVar117 = (fVar228 - fStack_250) + (fVar227 - fStack_254);
  fVar145 = (fVar188 - fStack_24c) + (fVar228 - fStack_250);
  fVar146 = (fVar188 - fStack_24c) + 0.0;
  local_e8._8_4_ = fStack_13c;
  local_e8._12_4_ = 0;
  fVar229 = (fVar214 - fStack_144) + (fVar189 - local_148);
  fVar253 = (fVar216 - fStack_140) + (fVar214 - fStack_144);
  fVar264 = (fVar217 - fStack_13c) + (fVar216 - fStack_140);
  fVar265 = (fVar217 - fStack_13c) + 0.0;
  auVar280._0_8_ =
       CONCAT44(fStack_144 * fVar117 - fStack_254 * fVar253,
                local_148 * fVar371 - local_258 * fVar229);
  auVar280._8_4_ = fStack_140 * fVar145 - fStack_250 * fVar264;
  auVar280._12_4_ = fStack_13c * fVar146 - fStack_24c * fVar265;
  auVar243._0_4_ = (float)local_348._0_4_ * fVar371 - local_238 * fVar229;
  auVar243._4_4_ = (float)local_348._4_4_ * fVar117 - fStack_234 * fVar253;
  auVar243._8_4_ = fStack_340 * fVar145 - fStack_230 * fVar264;
  auVar243._12_4_ = fStack_33c * fVar146 - fStack_22c * fVar265;
  auVar255._0_8_ =
       CONCAT44(auVar132._4_4_ * fVar117 - fVar253 * local_248._4_4_,
                auVar132._0_4_ * fVar371 - fVar229 * local_248._0_4_);
  auVar255._8_4_ = auVar132._8_4_ * fVar145 - fVar264 * local_248._8_4_;
  auVar255._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
  auVar382._0_4_ = fVar371 * fStack_144 - fVar229 * fStack_254;
  auVar382._4_4_ = fVar117 * fStack_140 - fVar253 * fStack_250;
  auVar382._8_4_ = fVar145 * fStack_13c - fVar264 * fStack_24c;
  auVar382._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
  auVar329._0_8_ =
       CONCAT44(fVar214 * fVar117 - fVar227 * fVar253,fVar189 * fVar371 - fVar218 * fVar229);
  auVar329._8_4_ = fVar216 * fVar145 - fVar228 * fVar264;
  auVar329._12_4_ = fVar217 * fVar146 - fVar188 * fVar265;
  auVar398._0_4_ = local_108 * fVar371 - local_138 * fVar229;
  auVar398._4_4_ = fStack_104 * fVar117 - fStack_134 * fVar253;
  auVar398._8_4_ = fStack_100 * fVar145 - fStack_130 * fVar264;
  auVar398._12_4_ = fStack_fc * fVar146 - fStack_12c * fVar265;
  auVar294._0_8_ =
       CONCAT44(local_128._4_4_ * fVar117 - fVar253 * local_d8._4_4_,
                local_128._0_4_ * fVar371 - fVar229 * local_d8._0_4_);
  auVar294._8_4_ = local_128._8_4_ * fVar145 - fVar264 * local_d8._8_4_;
  auVar294._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
  auVar135._0_4_ = fVar371 * fVar214 - fVar229 * fVar227;
  auVar135._4_4_ = fVar117 * fVar216 - fVar253 * fVar228;
  auVar135._8_4_ = fVar145 * fVar217 - fVar264 * fVar188;
  auVar135._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
  auVar173._8_4_ = auVar280._8_4_;
  auVar173._0_8_ = auVar280._0_8_;
  auVar173._12_4_ = auVar280._12_4_;
  auVar192 = minps(auVar173,auVar243);
  auVar171 = maxps(auVar280,auVar243);
  auVar244._8_4_ = auVar255._8_4_;
  auVar244._0_8_ = auVar255._0_8_;
  auVar244._12_4_ = auVar255._12_4_;
  auVar233 = minps(auVar244,auVar382);
  auVar192 = minps(auVar192,auVar233);
  auVar233 = maxps(auVar255,auVar382);
  auVar204 = maxps(auVar171,auVar233);
  auVar245._8_4_ = auVar329._8_4_;
  auVar245._0_8_ = auVar329._0_8_;
  auVar245._12_4_ = auVar329._12_4_;
  auVar233 = minps(auVar245,auVar398);
  auVar330 = maxps(auVar329,auVar398);
  auVar256._8_4_ = auVar294._8_4_;
  auVar256._0_8_ = auVar294._0_8_;
  auVar256._12_4_ = auVar294._12_4_;
  auVar171 = minps(auVar256,auVar135);
  auVar233 = minps(auVar233,auVar171);
  auVar192 = minps(auVar192,auVar233);
  auVar233 = maxps(auVar294,auVar135);
  auVar233 = maxps(auVar330,auVar233);
  auVar233 = maxps(auVar204,auVar233);
  bVar112 = auVar192._4_4_ <= fStack_154;
  bVar27 = auVar192._8_4_ <= fStack_150;
  bVar28 = auVar192._12_4_ <= fStack_14c;
  auVar92._4_4_ = -(uint)bVar27;
  auVar92._0_4_ = -(uint)bVar112;
  auVar92._8_4_ = -(uint)bVar28;
  auVar92._12_4_ = 0;
  auVar177 = auVar92 << 0x20;
  auVar281._0_4_ =
       -(uint)(local_168 <= auVar233._0_4_ && auVar192._0_4_ <= local_158) & local_178._0_4_;
  auVar281._4_4_ = -(uint)(fStack_164 <= auVar233._4_4_ && bVar112) & local_178._4_4_;
  auVar281._8_4_ = -(uint)(fStack_160 <= auVar233._8_4_ && bVar27) & local_178._8_4_;
  auVar281._12_4_ = -(uint)(fStack_15c <= auVar233._12_4_ && bVar28) & local_178._12_4_;
  uVar114 = movmskps((int)uVar105,auVar281);
  uVar105 = (ulong)uVar114;
  if (uVar114 != 0) {
    fVar371 = (fVar227 - fVar218) + (fStack_254 - local_258);
    fVar117 = (fVar228 - fVar227) + (fStack_250 - fStack_254);
    fVar145 = (fVar188 - fVar228) + (fStack_24c - fStack_250);
    fVar146 = (0.0 - fVar188) + (0.0 - fStack_24c);
    fVar229 = (fVar214 - fVar189) + (fStack_144 - local_148);
    fVar253 = (fVar216 - fVar214) + (fStack_140 - fStack_144);
    fVar264 = (fVar217 - fVar216) + (fStack_13c - fStack_140);
    fVar265 = (0.0 - fVar217) + (0.0 - fStack_13c);
    auVar408._0_8_ =
         CONCAT44(fStack_144 * fVar117 - fStack_254 * fVar253,
                  local_148 * fVar371 - local_258 * fVar229);
    auVar408._8_4_ = fStack_140 * fVar145 - fStack_250 * fVar264;
    auVar408._12_4_ = fStack_13c * fVar146 - fStack_24c * fVar265;
    auVar246._0_4_ = (float)local_348._0_4_ * fVar371 - local_238 * fVar229;
    auVar246._4_4_ = (float)local_348._4_4_ * fVar117 - fStack_234 * fVar253;
    auVar246._8_4_ = fStack_340 * fVar145 - fStack_230 * fVar264;
    auVar246._12_4_ = fStack_33c * fVar146 - fStack_22c * fVar265;
    auVar295._0_8_ =
         CONCAT44(auVar132._4_4_ * fVar117 - local_248._4_4_ * fVar253,
                  auVar132._0_4_ * fVar371 - local_248._0_4_ * fVar229);
    auVar295._8_4_ = auVar132._8_4_ * fVar145 - local_248._8_4_ * fVar264;
    auVar295._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
    auVar257._0_4_ = fStack_144 * fVar371 - fStack_254 * fVar229;
    auVar257._4_4_ = fStack_140 * fVar117 - fStack_250 * fVar253;
    auVar257._8_4_ = fStack_13c * fVar145 - fStack_24c * fVar264;
    auVar257._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
    auVar209._0_8_ =
         CONCAT44(fVar214 * fVar117 - fVar227 * fVar253,fVar189 * fVar371 - fVar218 * fVar229);
    auVar209._8_4_ = fVar216 * fVar145 - fVar228 * fVar264;
    auVar209._12_4_ = fVar217 * fVar146 - fVar188 * fVar265;
    auVar347._0_4_ = local_108 * fVar371 - local_138 * fVar229;
    auVar347._4_4_ = fStack_104 * fVar117 - fStack_134 * fVar253;
    auVar347._8_4_ = fStack_100 * fVar145 - fStack_130 * fVar264;
    auVar347._12_4_ = fStack_fc * fVar146 - fStack_12c * fVar265;
    auVar383._0_8_ =
         CONCAT44(local_128._4_4_ * fVar117 - local_d8._4_4_ * fVar253,
                  local_128._0_4_ * fVar371 - local_d8._0_4_ * fVar229);
    auVar383._8_4_ = local_128._8_4_ * fVar145 - local_d8._8_4_ * fVar264;
    auVar383._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
    auVar135._0_4_ = fVar371 * fVar214 - fVar229 * fVar227;
    auVar135._4_4_ = fVar117 * fVar216 - fVar253 * fVar228;
    auVar135._8_4_ = fVar145 * fVar217 - fVar264 * fVar188;
    auVar135._12_4_ = fVar146 * 0.0 - fVar265 * 0.0;
    auVar174._8_4_ = auVar408._8_4_;
    auVar174._0_8_ = auVar408._0_8_;
    auVar174._12_4_ = auVar408._12_4_;
    auVar192 = minps(auVar174,auVar246);
    auVar171 = maxps(auVar408,auVar246);
    auVar247._8_4_ = auVar295._8_4_;
    auVar247._0_8_ = auVar295._0_8_;
    auVar247._12_4_ = auVar295._12_4_;
    auVar233 = minps(auVar247,auVar257);
    auVar192 = minps(auVar192,auVar233);
    auVar233 = maxps(auVar295,auVar257);
    auVar330 = maxps(auVar171,auVar233);
    auVar248._8_4_ = auVar209._8_4_;
    auVar248._0_8_ = auVar209._0_8_;
    auVar248._12_4_ = auVar209._12_4_;
    auVar171 = minps(auVar248,auVar347);
    auVar233 = maxps(auVar209,auVar347);
    auVar258._8_4_ = auVar383._8_4_;
    auVar258._0_8_ = auVar383._0_8_;
    auVar258._12_4_ = auVar383._12_4_;
    auVar204 = minps(auVar258,auVar135);
    auVar171 = minps(auVar171,auVar204);
    auVar192 = minps(auVar192,auVar171);
    auVar171 = maxps(auVar383,auVar135);
    auVar233 = maxps(auVar233,auVar171);
    auVar233 = maxps(auVar330,auVar233);
    bVar112 = auVar192._4_4_ <= fStack_154;
    bVar27 = auVar192._8_4_ <= fStack_150;
    bVar28 = auVar192._12_4_ <= fStack_14c;
    auVar93._4_4_ = -(uint)bVar27;
    auVar93._0_4_ = -(uint)bVar112;
    auVar93._8_4_ = -(uint)bVar28;
    auVar93._12_4_ = 0;
    auVar177 = auVar93 << 0x20;
    auVar409._0_4_ =
         -(uint)(local_168 <= auVar233._0_4_ && auVar192._0_4_ <= local_158) & auVar281._0_4_;
    auVar409._4_4_ = -(uint)(fStack_164 <= auVar233._4_4_ && bVar112) & auVar281._4_4_;
    auVar409._8_4_ = -(uint)(fStack_160 <= auVar233._8_4_ && bVar27) & auVar281._8_4_;
    auVar409._12_4_ = -(uint)(fStack_15c <= auVar233._12_4_ && bVar28) & auVar281._12_4_;
    uVar114 = movmskps(uVar114,auVar409);
    uVar105 = (ulong)uVar114;
    auVar398 = local_118;
    if (uVar114 != 0) {
      uVar105 = (ulong)(byte)uVar114;
      auStack_208[uVar104] = uVar114 & 0xff;
      *(undefined8 *)(afStack_78 + uVar104 * 2) = local_408;
      *(undefined1 (*) [8])(afStack_58 + uVar104 * 2) = local_418;
      uVar104 = (ulong)((int)uVar104 + 1);
      auVar135 = _local_418;
    }
  }
LAB_003af7ed:
  _local_3f8 = auVar132;
  auVar192 = _local_3f8;
  if ((int)uVar104 == 0) {
    if (bVar111 != 0) goto LAB_003b08b2;
    fVar371 = ray->tfar;
    auVar182._4_4_ = -(uint)(fStack_184 <= fVar371);
    auVar182._0_4_ = -(uint)(local_188 <= fVar371);
    auVar182._8_4_ = -(uint)(fStack_180 <= fVar371);
    auVar182._12_4_ = -(uint)(fStack_17c <= fVar371);
    uVar113 = movmskps((int)uVar105,auVar182);
    uVar109 = (ulong)((uint)uVar109 & (uint)uVar109 + 0xf & uVar113);
    goto LAB_003ae43c;
  }
  uVar115 = (int)uVar104 - 1;
  uVar105 = (ulong)uVar115;
  uVar114 = auStack_208[uVar105];
  local_418._0_4_ = afStack_58[uVar105 * 2];
  local_418._4_4_ = afStack_58[uVar105 * 2 + 1];
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  uVar10 = 0;
  if (uVar114 != 0) {
    for (; (uVar114 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  uVar114 = uVar114 - 1 & uVar114;
  auStack_208[uVar105] = uVar114;
  if (uVar114 == 0) {
    uVar104 = (ulong)uVar115;
  }
  fVar117 = (float)(uVar10 + 1) * 0.33333334;
  fVar189 = auVar135._4_4_ * 0.0;
  fVar214 = auVar177._4_4_ * 0.0;
  fVar145 = afStack_78[uVar105 * 2];
  fVar146 = afStack_78[uVar105 * 2 + 1];
  fVar371 = fVar145 * (1.0 - (float)uVar10 * 0.33333334) + fVar146 * (float)uVar10 * 0.33333334;
  fVar117 = fVar145 * (1.0 - fVar117) + fVar146 * fVar117;
  fVar189 = fVar145 * (0.0 - fVar189) + fVar146 * fVar189;
  fVar146 = fVar145 * (0.0 - fVar214) + fVar146 * fVar214;
  fVar145 = fVar117 - fVar371;
  if (fVar145 < 0.16666667) {
    fVar228 = 1.0 - (float)local_418._0_4_;
    fVar229 = 1.0 - (float)local_418._0_4_;
    fVar265 = 1.0 - (float)local_418._4_4_;
    fVar359 = 1.0 - (float)local_418._4_4_;
    fVar227 = local_328._0_4_ * fVar228 + local_2e8 * (float)local_418._0_4_;
    fVar188 = local_328._4_4_ * fVar229 + fStack_2e4 * (float)local_418._0_4_;
    fVar253 = local_328._8_4_ * fVar265 + fStack_2e0 * (float)local_418._4_4_;
    fVar264 = local_328._12_4_ * fVar359 + fStack_2dc * (float)local_418._4_4_;
    fVar214 = local_338._0_4_ * fVar228 + (float)local_2f8._0_4_ * (float)local_418._0_4_;
    fVar216 = local_338._4_4_ * fVar229 + (float)local_2f8._4_4_ * (float)local_418._0_4_;
    fVar217 = local_338._8_4_ * fVar265 + fStack_2f0 * (float)local_418._4_4_;
    fVar218 = local_338._12_4_ * fVar359 + fStack_2ec * (float)local_418._4_4_;
    fVar352 = local_3b8 * fVar228 + local_308 * (float)local_418._0_4_;
    fVar231 = fStack_3b4 * fVar229 + fStack_304 * (float)local_418._0_4_;
    fVar309 = fStack_3b0 * fVar265 + fStack_300 * (float)local_418._4_4_;
    fVar336 = fStack_3ac * fVar359 + fStack_2fc * (float)local_418._4_4_;
    fVar267 = (fVar228 * (float)local_2d8._0_4_ + (float)local_418._0_4_ * (float)local_318._0_4_) -
              fVar352;
    fVar287 = (fVar229 * (float)local_2d8._4_4_ + (float)local_418._0_4_ * (float)local_318._4_4_) -
              fVar231;
    fVar288 = (fVar265 * fStack_2d0 + (float)local_418._4_4_ * fStack_310) - fVar309;
    fVar368 = (fVar359 * fStack_2cc + (float)local_418._4_4_ * fStack_30c) - fVar336;
    fVar228 = fVar371 * (fVar352 - fVar214) + fVar214;
    fVar229 = fVar371 * (fVar231 - fVar216) + fVar216;
    fVar265 = fVar371 * (fVar309 - fVar217) + fVar217;
    fVar359 = fVar371 * (fVar336 - fVar218) + fVar218;
    fVar230 = (fVar352 - fVar214) * fVar117 + fVar214;
    fVar303 = (fVar231 - fVar216) * fVar117 + fVar216;
    fVar320 = (fVar309 - fVar217) * fVar117 + fVar217;
    fVar339 = (fVar336 - fVar218) * fVar117 + fVar218;
    fVar376 = fVar371 * (fVar214 - fVar227) + fVar227;
    fVar385 = fVar371 * (fVar216 - fVar188) + fVar188;
    fVar387 = fVar371 * (fVar217 - fVar253) + fVar253;
    fVar390 = fVar371 * (fVar218 - fVar264) + fVar264;
    fVar376 = (fVar228 - fVar376) * fVar371 + fVar376;
    fVar385 = (fVar229 - fVar385) * fVar371 + fVar385;
    fVar387 = (fVar265 - fVar387) * fVar371 + fVar387;
    fVar390 = (fVar359 - fVar390) * fVar371 + fVar390;
    fVar228 = (((fVar371 * fVar267 + fVar352) - fVar228) * fVar371 + fVar228) - fVar376;
    fVar229 = (((fVar371 * fVar287 + fVar231) - fVar229) * fVar371 + fVar229) - fVar385;
    fVar265 = (((fVar371 * fVar288 + fVar309) - fVar265) * fVar371 + fVar265) - fVar387;
    fVar359 = (((fVar371 * fVar368 + fVar336) - fVar359) * fVar371 + fVar359) - fVar390;
    auVar210._0_4_ = fVar371 * fVar228 + fVar376;
    auVar210._4_4_ = fVar371 * fVar229 + fVar385;
    auVar210._8_4_ = fVar371 * fVar265 + fVar387;
    auVar210._12_4_ = fVar371 * fVar359 + fVar390;
    fVar227 = (fVar214 - fVar227) * fVar117 + fVar227;
    fVar188 = (fVar216 - fVar188) * fVar117 + fVar188;
    fVar253 = (fVar217 - fVar253) * fVar117 + fVar253;
    fVar264 = (fVar218 - fVar264) * fVar117 + fVar264;
    fVar227 = (fVar230 - fVar227) * fVar117 + fVar227;
    fVar188 = (fVar303 - fVar188) * fVar117 + fVar188;
    fVar253 = (fVar320 - fVar253) * fVar117 + fVar253;
    fVar264 = (fVar339 - fVar264) * fVar117 + fVar264;
    fVar216 = (((fVar267 * fVar117 + fVar352) - fVar230) * fVar117 + fVar230) - fVar227;
    fVar217 = (((fVar287 * fVar117 + fVar231) - fVar303) * fVar117 + fVar303) - fVar188;
    fVar218 = (((fVar288 * fVar117 + fVar309) - fVar320) * fVar117 + fVar320) - fVar253;
    fVar303 = (((fVar368 * fVar117 + fVar336) - fVar339) * fVar117 + fVar339) - fVar264;
    fVar227 = fVar117 * fVar216 + fVar227;
    fVar188 = fVar117 * fVar217 + fVar188;
    fVar253 = fVar117 * fVar218 + fVar253;
    fVar264 = fVar117 * fVar303 + fVar264;
    fVar214 = fVar145 * 0.33333334;
    fVar267 = fVar228 * (float)DAT_01f4afa0 * fVar214 + auVar210._0_4_;
    fVar287 = fVar229 * DAT_01f4afa0._4_4_ * fVar214 + auVar210._4_4_;
    fVar288 = fVar265 * DAT_01f4afa0._8_4_ * fVar214 + auVar210._8_4_;
    fVar368 = fVar359 * DAT_01f4afa0._12_4_ * fVar214 + auVar210._12_4_;
    fVar352 = fVar227 - fVar214 * fVar216 * (float)DAT_01f4afa0;
    fVar230 = fVar188 - fVar214 * fVar217 * DAT_01f4afa0._4_4_;
    fVar231 = fVar253 - fVar214 * fVar218 * DAT_01f4afa0._8_4_;
    fVar303 = fVar264 - fVar214 * fVar303 * DAT_01f4afa0._12_4_;
    auVar31._4_8_ = auVar398._8_8_;
    auVar31._0_4_ = auVar210._4_4_;
    auVar395._0_8_ = auVar31._0_8_ << 0x20;
    auVar395._8_4_ = auVar210._8_4_;
    auVar395._12_4_ = auVar210._12_4_;
    auVar396._8_8_ = auVar210._8_8_;
    auVar396._0_8_ = auVar395._8_8_;
    auVar32._4_8_ = DAT_01f4afa0._8_8_;
    auVar32._0_4_ = fVar188;
    auVar296._0_8_ = auVar32._0_8_ << 0x20;
    auVar296._8_4_ = fVar253;
    auVar296._12_4_ = fVar264;
    fVar228 = (fVar253 - fVar227) + (auVar210._8_4_ - auVar210._0_4_);
    fVar229 = (fVar264 - fVar188) + (auVar210._12_4_ - auVar210._4_4_);
    auVar331._0_4_ = fVar230 * fVar229;
    auVar331._4_4_ = fVar230 * fVar229;
    auVar331._8_4_ = fVar303 * fVar229;
    auVar331._12_4_ = fVar303 * fVar229;
    fVar214 = auVar210._0_4_ * fVar228 + auVar210._4_4_ * fVar229;
    fVar216 = auVar210._8_4_ * fVar228 + auVar210._12_4_ * fVar229;
    fVar265 = fVar267 * fVar228 + fVar287 * fVar229;
    fVar359 = fVar288 * fVar228 + fVar368 * fVar229;
    fVar309 = fVar352 * fVar228 + auVar331._0_4_;
    auVar282._0_8_ = CONCAT44(fVar230 * fVar228 + auVar331._4_4_,fVar309);
    auVar282._8_4_ = fVar231 * fVar228 + auVar331._8_4_;
    auVar282._12_4_ = fVar303 * fVar228 + auVar331._12_4_;
    fVar218 = fVar228 * fVar227 + fVar229 * fVar188;
    fVar320 = fVar228 * fVar253 + fVar229 * fVar264;
    auVar33._4_8_ = auVar331._8_8_;
    auVar33._0_4_ = fVar287 * fVar228 + fVar287 * fVar229;
    auVar332._0_8_ = auVar33._0_8_ << 0x20;
    auVar332._8_4_ = fVar359;
    auVar332._12_4_ = fVar368 * fVar228 + fVar368 * fVar229;
    fVar217 = fVar265;
    if (fVar265 <= fVar214) {
      fVar217 = fVar214;
      fVar214 = fVar265;
    }
    auVar333._8_8_ = auVar332._8_8_;
    auVar333._0_8_ = auVar333._8_8_;
    auVar133._8_4_ = auVar282._8_4_;
    auVar133._0_8_ = auVar282._0_8_;
    auVar133._12_4_ = auVar282._12_4_;
    if (fVar218 <= fVar309) {
      auVar133._0_4_ = fVar218;
    }
    if (auVar133._0_4_ <= fVar214) {
      fVar214 = auVar133._0_4_;
    }
    auVar34._4_8_ = auVar133._8_8_;
    auVar34._0_4_ = fVar228 * fVar188 + fVar229 * fVar188;
    auVar134._0_8_ = auVar34._0_8_ << 0x20;
    auVar134._8_4_ = fVar320;
    auVar134._12_4_ = fVar228 * fVar264 + fVar229 * fVar264;
    if (fVar218 <= fVar309) {
      fVar218 = fVar309;
    }
    auVar135._8_8_ = auVar134._8_8_;
    auVar135._0_8_ = auVar135._8_8_;
    if (fVar218 <= fVar217) {
      fVar218 = fVar217;
    }
    if (fVar359 <= fVar216) {
      auVar333._0_4_ = fVar216;
      fVar216 = fVar359;
    }
    auVar175._8_4_ = auVar282._8_4_;
    auVar175._0_8_ = auVar282._8_8_;
    auVar175._12_4_ = auVar282._12_4_;
    if (fVar320 <= auVar282._8_4_) {
      auVar175._0_4_ = fVar320;
    }
    if (auVar175._0_4_ <= fVar216) {
      fVar216 = auVar175._0_4_;
    }
    if (fVar320 <= auVar282._8_4_) {
      auVar135._0_4_ = auVar282._8_4_;
    }
    if (auVar135._0_4_ <= auVar333._0_4_) {
      auVar135._0_4_ = auVar333._0_4_;
    }
    bVar112 = 3 < (uint)uVar104;
    uVar35 = (undefined3)(uVar115 >> 8);
    uVar105 = (ulong)CONCAT31(uVar35,bVar112);
    fVar217 = auVar135._0_4_;
    auVar398 = auVar396;
    if ((0.0001 <= fVar214) || (fVar217 <= -0.0001)) goto LAB_003afafc;
    goto LAB_003afb45;
  }
  goto LAB_003af18c;
LAB_003afafc:
  auVar177._0_12_ = ZEXT812(0x38d1b717);
  auVar177._12_4_ = 0.0;
  if ((0.0001 <= fVar216 || fVar218 <= -0.0001) &&
     ((0.0001 <= fVar214 || fVar218 <= -0.0001 &&
      (auVar132 = _local_3f8, 0.0001 <= fVar216 || fVar217 <= -0.0001)))) goto LAB_003af7ed;
LAB_003afb45:
  local_3f8 = (undefined1  [8])auVar296._8_8_;
  auVar132 = _local_3f8;
  bVar112 = bVar112 || fVar145 < 0.001;
  uVar105 = (ulong)CONCAT31(uVar35,bVar112);
  fVar229 = (float)(~-(uint)(fVar214 < 0.0) & 0x3f800000 | -(uint)(fVar214 < 0.0) & 0xbf800000);
  fVar265 = (float)(~-(uint)(fVar218 < 0.0) & 0x3f800000 | -(uint)(fVar218 < 0.0) & 0xbf800000);
  fVar228 = 0.0;
  if ((fVar229 == fVar265) && (!NAN(fVar229) && !NAN(fVar265))) {
    fVar228 = INFINITY;
  }
  fVar359 = 0.0;
  if ((fVar229 == fVar265) && (!NAN(fVar229) && !NAN(fVar265))) {
    fVar359 = -INFINITY;
  }
  fVar309 = (float)(~-(uint)(fVar216 < 0.0) & 0x3f800000 | -(uint)(fVar216 < 0.0) & 0xbf800000);
  if ((fVar229 != fVar309) || (fVar320 = fVar359, NAN(fVar229) || NAN(fVar309))) {
    if ((fVar216 != fVar214) || (NAN(fVar216) || NAN(fVar214))) {
      fVar216 = -fVar214 / (fVar216 - fVar214);
      fVar216 = (1.0 - fVar216) * 0.0 + fVar216;
      fVar320 = fVar216;
    }
    else {
      fVar216 = 0.0;
      if ((fVar214 != 0.0) || (fVar320 = 1.0, NAN(fVar214))) {
        fVar216 = INFINITY;
        fVar320 = -INFINITY;
      }
    }
    if (fVar216 <= fVar228) {
      fVar228 = fVar216;
    }
    if (fVar320 <= fVar359) {
      fVar320 = fVar359;
    }
  }
  fVar214 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar217 < 0.0) * 4);
  if ((fVar265 != fVar214) || (fVar216 = fVar320, NAN(fVar265) || NAN(fVar214))) {
    if ((fVar217 != fVar218) || (NAN(fVar217) || NAN(fVar218))) {
      fVar229 = -fVar218 / (fVar217 - fVar218);
      fVar229 = (1.0 - fVar229) * 0.0 + fVar229;
      fVar216 = fVar229;
    }
    else {
      fVar229 = 0.0;
      if ((fVar218 != 0.0) || (fVar216 = 1.0, NAN(fVar218))) {
        fVar229 = INFINITY;
        fVar216 = -INFINITY;
      }
    }
    if (fVar229 <= fVar228) {
      fVar228 = fVar229;
    }
    if (fVar216 <= fVar320) {
      fVar216 = fVar320;
    }
  }
  if ((fVar309 != fVar214) || (NAN(fVar309) || NAN(fVar214))) {
    fVar228 = (float)(~-(uint)(fVar228 < 1.0) & 0x3f800000 | (uint)fVar228 & -(uint)(fVar228 < 1.0))
    ;
    fVar216 = (float)(~-(uint)(fVar216 < 1.0) & (uint)fVar216 | -(uint)(fVar216 < 1.0) & 0x3f800000)
    ;
  }
  fStack_3f0 = auVar192._8_4_;
  fStack_3ec = auVar192._12_4_;
  auVar176._0_8_ =
       CONCAT44(~-(uint)(fVar216 < 1.0),~-(uint)(fVar228 < 0.0) & (uint)fVar228) &
       0x3f800000ffffffff;
  auVar176._8_8_ = 0;
  auVar177 = auVar176 | ZEXT416((uint)fVar216 & -(uint)(fVar216 < 1.0)) << 0x20;
  fVar214 = auVar177._4_4_;
  auVar135._4_4_ = fVar214;
  auVar135._0_4_ = fVar214;
  auVar135._8_4_ = fVar214;
  auVar135._12_4_ = fVar214;
  _local_348 = auVar396;
  if (fVar214 < auVar177._0_4_) goto LAB_003af7ed;
  fVar216 = auVar177._0_4_ + -0.1;
  fVar218 = auVar177._8_4_ + 0.0;
  fVar228 = auVar177._12_4_ + 0.0;
  uVar114 = -(uint)(fVar214 + 0.1 < 1.0);
  fVar216 = (float)(~-(uint)(fVar216 < 0.0) & (uint)fVar216);
  fVar214 = (float)(~uVar114 & 0x3f800000 | (uint)(fVar214 + 0.1) & uVar114);
  fVar339 = 1.0 - fVar216;
  fVar376 = 1.0 - fVar216;
  fVar385 = 1.0 - fVar214;
  fVar387 = 1.0 - fVar214;
  fVar229 = auVar210._0_4_ * fVar339 + auVar210._8_4_ * fVar216;
  fVar265 = auVar210._4_4_ * fVar376 + auVar210._12_4_ * fVar216;
  fVar359 = auVar210._0_4_ * fVar385 + auVar210._8_4_ * fVar214;
  fVar309 = auVar210._4_4_ * fVar387 + auVar210._12_4_ * fVar214;
  fVar320 = fVar267 * fVar339 + fVar288 * fVar216;
  fVar336 = fVar287 * fVar376 + fVar368 * fVar216;
  fVar267 = fVar267 * fVar385 + fVar288 * fVar214;
  fVar287 = fVar287 * fVar387 + fVar368 * fVar214;
  fVar288 = fVar352 * fVar339 + fVar231 * fVar216;
  fVar368 = fVar230 * fVar376 + fVar303 * fVar216;
  fVar352 = fVar352 * fVar385 + fVar231 * fVar214;
  fVar230 = fVar230 * fVar387 + fVar303 * fVar214;
  fVar253 = fVar339 * fVar227 + fVar253 * fVar216;
  fVar264 = fVar376 * fVar188 + fVar264 * fVar216;
  fVar231 = fVar385 * fVar227 + fStack_3f0 * fVar214;
  fVar303 = fVar387 * fVar188 + fStack_3ec * fVar214;
  fVar227 = (float)local_418._4_4_ * fVar218;
  fVar188 = (float)local_418._4_4_ * fVar228;
  fVar339 = (float)local_418._0_4_ * (1.0 - fVar214);
  fStack_410 = (float)local_418._0_4_ * (0.0 - fVar218);
  fStack_40c = (float)local_418._0_4_ * (0.0 - fVar228);
  local_418._0_4_ = (float)local_418._0_4_ * (1.0 - fVar216) + (float)local_418._4_4_ * fVar216;
  local_418._4_4_ = fVar339 + (float)local_418._4_4_ * fVar214;
  fStack_410 = fStack_410 + fVar227;
  fStack_40c = fStack_40c + fVar188;
  fVar145 = 1.0 / fVar145;
  auVar178._0_4_ = fVar231 - fVar253;
  auVar178._4_4_ = fVar303 - fVar264;
  auVar178._8_4_ = fVar231 - fVar231;
  auVar178._12_4_ = fVar303 - fVar303;
  auVar224._0_8_ = CONCAT44(fVar230 - fVar368,fVar352 - fVar288);
  auVar224._8_4_ = fVar352 - fVar352;
  auVar224._12_4_ = fVar230 - fVar230;
  auVar259._0_4_ = fVar267 - fVar320;
  auVar259._4_4_ = fVar287 - fVar336;
  auVar259._8_4_ = fVar267 - fVar267;
  auVar259._12_4_ = fVar287 - fVar287;
  auVar334._0_8_ = CONCAT44((fVar336 - fVar265) * 3.0,(fVar320 - fVar229) * 3.0);
  auVar334._8_4_ = (fVar267 - fVar359) * 3.0;
  auVar334._12_4_ = (fVar287 - fVar309) * 3.0;
  auVar249._0_8_ = CONCAT44((fVar368 - fVar336) * 3.0,(fVar288 - fVar320) * 3.0);
  auVar249._8_4_ = (fVar352 - fVar267) * 3.0;
  auVar249._12_4_ = (fVar230 - fVar287) * 3.0;
  auVar364._0_4_ = (fVar253 - fVar288) * 3.0;
  auVar364._4_4_ = (fVar264 - fVar368) * 3.0;
  auVar364._8_4_ = (fVar231 - fVar352) * 3.0;
  auVar364._12_4_ = (fVar303 - fVar230) * 3.0;
  auVar283._8_4_ = auVar249._8_4_;
  auVar283._0_8_ = auVar249._0_8_;
  auVar283._12_4_ = auVar249._12_4_;
  auVar233 = minps(auVar283,auVar364);
  auVar192 = maxps(auVar249,auVar364);
  auVar348._8_4_ = auVar334._8_4_;
  auVar348._0_8_ = auVar334._0_8_;
  auVar348._12_4_ = auVar334._12_4_;
  auVar204 = minps(auVar348,auVar233);
  auVar171 = maxps(auVar334,auVar192);
  auVar36._4_8_ = auVar192._8_8_;
  auVar36._0_4_ = auVar204._4_4_;
  auVar250._0_8_ = auVar36._0_8_ << 0x20;
  auVar250._8_4_ = auVar204._8_4_;
  auVar250._12_4_ = auVar204._12_4_;
  auVar251._8_8_ = auVar204._8_8_;
  auVar251._0_8_ = auVar250._8_8_;
  auVar37._4_8_ = auVar233._8_8_;
  auVar37._0_4_ = auVar171._4_4_;
  auVar284._0_8_ = auVar37._0_8_ << 0x20;
  auVar284._8_4_ = auVar171._8_4_;
  auVar284._12_4_ = auVar171._12_4_;
  auVar285._8_8_ = auVar171._8_8_;
  auVar285._0_8_ = auVar284._8_8_;
  auVar233 = minps(auVar204,auVar251);
  auVar192 = maxps(auVar171,auVar285);
  fVar376 = auVar233._0_4_ * fVar145;
  fVar385 = auVar233._4_4_ * fVar145;
  fVar387 = auVar233._8_4_ * fVar145;
  fVar390 = auVar233._12_4_ * fVar145;
  fVar287 = fVar145 * auVar192._0_4_;
  fVar368 = fVar145 * auVar192._4_4_;
  fVar230 = fVar145 * auVar192._8_4_;
  fVar145 = fVar145 * auVar192._12_4_;
  fVar336 = 1.0 / ((float)local_418._4_4_ - (float)local_418._0_4_);
  auVar136._0_8_ = CONCAT44(fVar309 - fVar265,fVar359 - fVar229);
  auVar136._8_4_ = fVar359 - fVar359;
  auVar136._12_4_ = fVar309 - fVar309;
  auVar297._8_4_ = auVar136._8_4_;
  auVar297._0_8_ = auVar136._0_8_;
  auVar297._12_4_ = auVar136._12_4_;
  auVar171 = minps(auVar297,auVar259);
  auVar192 = maxps(auVar136,auVar259);
  auVar211._8_4_ = auVar224._8_4_;
  auVar211._0_8_ = auVar224._0_8_;
  auVar211._12_4_ = auVar224._12_4_;
  auVar233 = minps(auVar211,auVar178);
  auVar171 = minps(auVar171,auVar233);
  auVar233 = maxps(auVar224,auVar178);
  auVar192 = maxps(auVar192,auVar233);
  fVar309 = auVar171._0_4_ * fVar336;
  fVar320 = auVar171._4_4_ * fVar336;
  fVar339 = fVar336 * auVar192._0_4_;
  fVar336 = fVar336 * auVar192._4_4_;
  local_3f8._4_4_ = local_418._0_4_;
  local_3f8._0_4_ = fVar371;
  fStack_3f0 = fVar117;
  fStack_3ec = (float)local_418._4_4_;
  auVar286._4_4_ = local_418._4_4_;
  auVar286._0_4_ = fVar117;
  auVar286._8_4_ = fVar189;
  auVar286._12_4_ = fVar146;
  fVar264 = (fVar371 + fVar117) * 0.5;
  fVar265 = ((float)local_418._0_4_ + (float)local_418._4_4_) * 0.5;
  fVar359 = (fVar117 + fVar189) * 0.0;
  fVar267 = ((float)local_418._4_4_ + fVar146) * 0.0;
  fVar214 = local_88 * fVar264 + (float)local_2a8;
  fVar216 = fStack_84 * fVar264 + local_2a8._4_4_;
  fVar218 = fStack_80 * fVar264 + fStack_2a0;
  fVar227 = fStack_7c * fVar264 + fStack_29c;
  fVar228 = local_98 * fVar264 + local_2b8;
  fVar188 = fStack_94 * fVar264 + fStack_2b4;
  fVar229 = fStack_90 * fVar264 + (float)uStack_2b0;
  fVar253 = fStack_8c * fVar264 + uStack_2b0._4_4_;
  fVar214 = (fVar228 - fVar214) * fVar264 + fVar214;
  fVar216 = (fVar188 - fVar216) * fVar264 + fVar216;
  fVar218 = (fVar229 - fVar218) * fVar264 + fVar218;
  fVar227 = (fVar253 - fVar227) * fVar264 + fVar227;
  fVar228 = (((local_a8 * fVar264 + (float)local_2c8) - fVar228) * fVar264 + fVar228) - fVar214;
  fVar188 = (((fStack_a4 * fVar264 + local_2c8._4_4_) - fVar188) * fVar264 + fVar188) - fVar216;
  fVar229 = (((fStack_a0 * fVar264 + fStack_2c0) - fVar229) * fVar264 + fVar229) - fVar218;
  fVar253 = (((fStack_9c * fVar264 + fStack_2bc) - fVar253) * fVar264 + fVar253) - fVar227;
  fVar214 = fVar264 * fVar228 + fVar214;
  fVar216 = fVar264 * fVar188 + fVar216;
  fVar228 = fVar228 * 3.0;
  fVar188 = fVar188 * 3.0;
  fVar218 = (fVar264 * fVar229 + fVar218) - fVar214;
  fVar227 = (fVar264 * fVar253 + fVar227) - fVar216;
  fVar228 = (fVar229 * 3.0 - fVar228) * fVar265 + fVar228;
  fVar188 = (fVar253 * 3.0 - fVar188) * fVar265 + fVar188;
  auVar225._0_8_ = CONCAT44(fVar228,fVar218) ^ 0x80000000;
  auVar225._8_4_ = fVar228;
  auVar225._12_4_ = fVar228;
  fVar399 = fVar371 - fVar264;
  fVar401 = (float)local_418._0_4_ - fVar265;
  fVar403 = fVar117 - fVar359;
  fVar405 = (float)local_418._4_4_ - fVar267;
  fVar411 = fVar117 - fVar264;
  fVar412 = (float)local_418._4_4_ - fVar265;
  fVar189 = fVar189 - fVar359;
  fVar146 = fVar146 - fVar267;
  fVar214 = fVar218 * fVar265 + fVar214;
  fVar216 = fVar227 * fVar265 + fVar216;
  auVar252._0_8_ = CONCAT44(fVar188,fVar227) ^ 0x8000000000000000;
  auVar252._8_4_ = -fVar188;
  auVar252._12_4_ = -fVar188;
  auVar137._0_4_ = fVar227 * fVar228 - fVar188 * fVar218;
  auVar137._4_4_ = auVar137._0_4_;
  auVar137._8_4_ = auVar137._0_4_;
  auVar137._12_4_ = auVar137._0_4_;
  auVar233 = divps(auVar252,auVar137);
  auVar192 = divps(auVar225,auVar137);
  fVar359 = auVar233._0_4_;
  fVar267 = auVar233._4_4_;
  fVar229 = auVar192._0_4_;
  fVar253 = auVar192._4_4_;
  fVar264 = fVar264 - (fVar216 * fVar229 + fVar214 * fVar359);
  fVar228 = fVar265 - (fVar216 * fVar253 + fVar214 * fVar267);
  fVar188 = fVar265 - (fVar216 * auVar192._8_4_ + fVar214 * auVar233._8_4_);
  fVar265 = fVar265 - (fVar216 * auVar192._12_4_ + fVar214 * auVar233._12_4_);
  auVar179._0_8_ = CONCAT44(fVar267 * fVar309,fVar267 * fVar376);
  auVar179._8_4_ = fVar267 * fVar385;
  auVar179._12_4_ = fVar267 * fVar320;
  auVar138._0_4_ = fVar267 * fVar287;
  auVar138._4_4_ = fVar267 * fVar339;
  auVar138._8_4_ = fVar267 * fVar368;
  auVar138._12_4_ = fVar267 * fVar336;
  auVar419._8_4_ = auVar179._8_4_;
  auVar419._0_8_ = auVar179._0_8_;
  auVar419._12_4_ = auVar179._12_4_;
  auVar204 = minps(auVar419,auVar138);
  auVar192 = maxps(auVar138,auVar179);
  auVar260._0_8_ = CONCAT44(fVar253 * fVar320,fVar253 * fVar385);
  auVar260._8_4_ = fVar253 * fVar387;
  auVar260._12_4_ = fVar253 * fVar390;
  auVar180._0_4_ = fVar253 * fVar368;
  auVar180._4_4_ = fVar253 * fVar336;
  auVar180._8_4_ = fVar253 * fVar230;
  auVar180._12_4_ = fVar253 * fVar145;
  auVar349._8_4_ = auVar260._8_4_;
  auVar349._0_8_ = auVar260._0_8_;
  auVar349._12_4_ = auVar260._12_4_;
  auVar171 = minps(auVar349,auVar180);
  auVar233 = maxps(auVar180,auVar260);
  fVar214 = 0.0 - (auVar233._0_4_ + auVar192._0_4_);
  fVar216 = 1.0 - (auVar233._4_4_ + auVar192._4_4_);
  fVar218 = 0.0 - (auVar233._8_4_ + auVar192._8_4_);
  fVar227 = 0.0 - (auVar233._12_4_ + auVar192._12_4_);
  fVar288 = 0.0 - (auVar171._0_4_ + auVar204._0_4_);
  fVar352 = 1.0 - (auVar171._4_4_ + auVar204._4_4_);
  fVar231 = 0.0 - (auVar171._8_4_ + auVar204._8_4_);
  fVar303 = 0.0 - (auVar171._12_4_ + auVar204._12_4_);
  auVar181._0_8_ = CONCAT44(fVar401 * fVar216,fVar399 * fVar214);
  auVar181._8_4_ = fVar403 * fVar218;
  auVar181._12_4_ = fVar405 * fVar227;
  auVar365._0_8_ = CONCAT44(fVar309 * fVar359,fVar376 * fVar359);
  auVar365._8_4_ = fVar385 * fVar359;
  auVar365._12_4_ = fVar320 * fVar359;
  auVar261._0_4_ = fVar359 * fVar287;
  auVar261._4_4_ = fVar359 * fVar339;
  auVar261._8_4_ = fVar359 * fVar368;
  auVar261._12_4_ = fVar359 * fVar336;
  auVar350._8_4_ = auVar365._8_4_;
  auVar350._0_8_ = auVar365._0_8_;
  auVar350._12_4_ = auVar365._12_4_;
  auVar233 = minps(auVar350,auVar261);
  auVar192 = maxps(auVar261,auVar365);
  auVar298._0_8_ = CONCAT44(fVar320 * fVar229,fVar385 * fVar229);
  auVar298._8_4_ = fVar387 * fVar229;
  auVar298._12_4_ = fVar390 * fVar229;
  auVar366._0_4_ = fVar229 * fVar368;
  auVar366._4_4_ = fVar229 * fVar336;
  auVar366._8_4_ = fVar229 * fVar230;
  auVar366._12_4_ = fVar229 * fVar145;
  auVar410._8_4_ = auVar298._8_4_;
  auVar410._0_8_ = auVar298._0_8_;
  auVar410._12_4_ = auVar298._12_4_;
  auVar204 = minps(auVar410,auVar366);
  auVar351._0_4_ = fVar399 * fVar288;
  auVar351._4_4_ = fVar401 * fVar352;
  auVar351._8_4_ = fVar403 * fVar231;
  auVar351._12_4_ = fVar405 * fVar303;
  auVar139._0_8_ = CONCAT44(fVar216 * fVar412,fVar214 * fVar411);
  auVar139._8_4_ = fVar218 * fVar189;
  auVar139._12_4_ = fVar227 * fVar146;
  auVar266._0_4_ = fVar288 * fVar411;
  auVar266._4_4_ = fVar352 * fVar412;
  auVar266._8_4_ = fVar231 * fVar189;
  auVar266._12_4_ = fVar303 * fVar146;
  auVar171 = maxps(auVar366,auVar298);
  fVar145 = 1.0 - (auVar171._0_4_ + auVar192._0_4_);
  fVar214 = 0.0 - (auVar171._4_4_ + auVar192._4_4_);
  fVar216 = 0.0 - (auVar171._8_4_ + auVar192._8_4_);
  fVar218 = 0.0 - (auVar171._12_4_ + auVar192._12_4_);
  fVar227 = 1.0 - (auVar204._0_4_ + auVar233._0_4_);
  fVar287 = 0.0 - (auVar204._4_4_ + auVar233._4_4_);
  fVar288 = 0.0 - (auVar204._8_4_ + auVar233._8_4_);
  fVar368 = 0.0 - (auVar204._12_4_ + auVar233._12_4_);
  auVar299._0_8_ = CONCAT44(fVar401 * fVar214,fVar399 * fVar145);
  auVar299._8_4_ = fVar403 * fVar216;
  auVar299._12_4_ = fVar405 * fVar218;
  auVar384._0_4_ = fVar399 * fVar227;
  auVar384._4_4_ = fVar401 * fVar287;
  auVar384._8_4_ = fVar403 * fVar288;
  auVar384._12_4_ = fVar405 * fVar368;
  auVar262._0_8_ = CONCAT44(fVar214 * fVar412,fVar145 * fVar411);
  auVar262._8_4_ = fVar216 * fVar189;
  auVar262._12_4_ = fVar218 * fVar146;
  auVar335._0_4_ = fVar227 * fVar411;
  auVar335._4_4_ = fVar287 * fVar412;
  auVar335._8_4_ = fVar288 * fVar189;
  auVar335._12_4_ = fVar368 * fVar146;
  auVar367._8_4_ = auVar299._8_4_;
  auVar367._0_8_ = auVar299._0_8_;
  auVar367._12_4_ = auVar299._12_4_;
  auVar192 = minps(auVar367,auVar384);
  auVar397._8_4_ = auVar262._8_4_;
  auVar397._0_8_ = auVar262._0_8_;
  auVar397._12_4_ = auVar262._12_4_;
  auVar398 = minps(auVar397,auVar335);
  auVar330 = minps(auVar192,auVar398);
  auVar233 = maxps(auVar384,auVar299);
  auVar192 = maxps(auVar335,auVar262);
  auVar171 = maxps(auVar192,auVar233);
  auVar300._8_4_ = auVar181._8_4_;
  auVar300._0_8_ = auVar181._0_8_;
  auVar300._12_4_ = auVar181._12_4_;
  auVar233 = minps(auVar300,auVar351);
  auVar263._8_4_ = auVar139._8_4_;
  auVar263._0_8_ = auVar139._0_8_;
  auVar263._12_4_ = auVar139._12_4_;
  auVar192 = minps(auVar263,auVar266);
  auVar233 = minps(auVar233,auVar192);
  auVar204 = maxps(auVar351,auVar181);
  auVar192 = maxps(auVar266,auVar139);
  auVar192 = maxps(auVar192,auVar204);
  auVar301._0_4_ = auVar330._4_4_ + auVar330._0_4_ + fVar264;
  auVar301._4_4_ = auVar233._4_4_ + auVar233._0_4_ + fVar228;
  auVar301._8_4_ = auVar330._8_4_ + auVar330._4_4_ + fVar188;
  auVar301._12_4_ = auVar330._12_4_ + auVar233._4_4_ + fVar265;
  fVar145 = auVar171._4_4_ + auVar171._0_4_ + fVar264;
  fVar146 = auVar192._4_4_ + auVar192._0_4_ + fVar228;
  auVar140._4_4_ = fVar146;
  auVar140._0_4_ = fVar145;
  auVar177 = maxps(_local_3f8,auVar301);
  auVar140._8_4_ = auVar171._8_4_ + auVar171._4_4_ + fVar188;
  auVar140._12_4_ = auVar171._12_4_ + auVar192._4_4_ + fVar265;
  auVar192 = minps(auVar140,auVar286);
  iVar148 = -(uint)(auVar192._0_4_ < auVar177._0_4_);
  iVar183 = -(uint)(auVar192._4_4_ < auVar177._4_4_);
  auVar141._4_4_ = iVar183;
  auVar141._0_4_ = iVar148;
  auVar141._8_4_ = iVar183;
  auVar141._12_4_ = iVar183;
  auVar135._8_8_ = auVar141._8_8_;
  auVar135._4_4_ = (float)iVar148;
  auVar135._0_4_ = (float)iVar148;
  iVar148 = movmskpd((uint)(fVar217 < 0.0),auVar135);
  auVar132 = _local_3f8;
  if (iVar148 != 0) goto LAB_003af7ed;
  bVar102 = 0;
  if ((fVar371 < auVar301._0_4_) && (fVar145 < fVar117)) {
    bVar102 = -(fVar146 < (float)local_418._4_4_) & (float)local_418._0_4_ < auVar301._4_4_;
  }
  bVar102 = bVar112 | bVar102;
  uVar105 = (ulong)CONCAT31(uVar35,bVar102);
  if (bVar102 != 1) goto LAB_003af18c;
  uVar105 = 0xc9;
  do {
    uVar105 = uVar105 - 1;
    auVar398 = local_b8;
    if (uVar105 == 0) goto LAB_003af7ed;
    fVar117 = 1.0 - fVar264;
    fVar214 = fVar264 * fVar264 * fVar264;
    fVar189 = fVar264 * fVar264 * 3.0 * fVar117;
    fVar371 = fVar117 * fVar117 * fVar117;
    fVar216 = fVar264 * 3.0 * fVar117 * fVar117;
    fVar117 = fVar371 * (float)local_2a8 +
              fVar216 * local_2b8 + fVar189 * (float)local_2c8 + fVar214 * local_b8._0_4_;
    fVar145 = fVar371 * local_2a8._4_4_ +
              fVar216 * fStack_2b4 + fVar189 * local_2c8._4_4_ + fVar214 * local_b8._4_4_;
    fVar146 = fVar371 * fStack_2a0 +
              fVar216 * (float)uStack_2b0 + fVar189 * fStack_2c0 + fVar214 * local_b8._8_4_;
    fVar189 = fVar371 * fStack_29c +
              fVar216 * uStack_2b0._4_4_ + fVar189 * fStack_2bc + fVar214 * local_b8._12_4_;
    fVar214 = (fVar146 - fVar117) * fVar228;
    fVar216 = (fVar189 - fVar145) * fVar228;
    fVar371 = (fVar146 - fVar117) * fVar228 + fVar117;
    fVar146 = (fVar189 - fVar145) * fVar228 + fVar145;
    fVar264 = fVar264 - (fVar146 * fVar229 + fVar371 * fVar359);
    fVar228 = fVar228 - (fVar146 * fVar253 + fVar371 * fVar267);
    fVar189 = ABS(fVar146);
    auVar135._0_8_ = CONCAT44(fVar146,fVar371) & 0x7fffffff7fffffff;
    auVar135._8_4_ = ABS(fVar214 + fVar117);
    auVar135._12_4_ = ABS(fVar216 + fVar145);
    auVar177._0_8_ = CONCAT44(fVar146,fVar146) & 0x7fffffff7fffffff;
    auVar177._8_4_ = fVar189;
    auVar177._12_4_ = fVar189;
    if (fVar189 <= ABS(fVar371)) {
      auVar177._0_4_ = ABS(fVar371);
    }
  } while (local_c8 <= auVar177._0_4_);
  if ((((fVar264 < 0.0) || (1.0 < fVar264)) ||
      (auVar177._4_4_ = fVar228, auVar177._0_4_ = fVar228, auVar177._8_4_ = fVar228,
      auVar177._12_4_ = fVar228, fVar228 < 0.0)) || (1.0 < fVar228)) goto LAB_003af7ed;
  fVar371 = (pre->ray_space).vx.field_0.m128[2];
  fVar117 = (pre->ray_space).vy.field_0.m128[2];
  fVar145 = (pre->ray_space).vz.field_0.m128[2];
  fVar146 = (ray->org).field_0.m128[0];
  fVar189 = (ray->org).field_0.m128[1];
  fVar214 = (ray->org).field_0.m128[2];
  fVar216 = (ray->org).field_0.m128[3];
  auVar142._0_4_ = (local_378 - fVar146) * fVar371;
  auVar142._4_4_ = (fStack_374 - fVar189) * fVar117;
  auVar142._8_4_ = (fStack_370 - fVar214) * fVar145;
  auVar142._12_4_ = (fStack_36c - fVar216) * 0.0;
  auVar143._8_8_ = auVar142._8_8_;
  auVar143._0_8_ = auVar143._8_8_;
  auVar135._4_12_ = auVar143._4_12_;
  fVar253 = 1.0 - fVar228;
  fVar229 = 1.0 - fVar264;
  fVar217 = fVar229 * fVar229 * fVar229;
  fVar218 = fVar264 * 3.0 * fVar229 * fVar229;
  fVar188 = fVar264 * fVar264 * fVar264;
  fVar227 = fVar264 * fVar264 * 3.0 * fVar229;
  auVar135._0_4_ =
       ((auVar142._8_4_ + auVar142._4_4_ + auVar142._0_4_) * fVar253 +
       ((fStack_360 - fVar214) * fVar145 +
       (fStack_364 - fVar189) * fVar117 + (local_368 - fVar146) * fVar371) * fVar228) * fVar217 +
       (((fStack_380 - fVar214) * fVar145 +
        (fStack_384 - fVar189) * fVar117 + (local_388 - fVar146) * fVar371) * fVar253 +
       ((fStack_350 - fVar214) * fVar145 +
       (fStack_354 - fVar189) * fVar117 + (local_358 - fVar146) * fVar371) * fVar228) * fVar218 +
       (((fStack_3a0 - fVar214) * fVar145 +
        (fStack_3a4 - fVar189) * fVar117 + (local_3a8 - fVar146) * fVar371) * fVar253 +
       ((fStack_3c0 - fVar214) * fVar145 +
       (fStack_3c4 - fVar189) * fVar117 + (local_3c8 - fVar146) * fVar371) * fVar228) * fVar227 +
       (fVar253 * ((fStack_390 - fVar214) * fVar145 +
                  (fStack_394 - fVar189) * fVar117 + (local_398 - fVar146) * fVar371) +
       ((fStack_210 - fVar214) * fVar145 +
       (fStack_214 - fVar189) * fVar117 + (local_218 - fVar146) * fVar371) * fVar228) * fVar188;
  if (auVar135._0_4_ < fVar216) goto LAB_003af7ed;
  fVar371 = ray->tfar;
  auVar398 = ZEXT416((uint)fVar371);
  if (fVar371 < auVar135._0_4_) goto LAB_003af7ed;
  fVar214 = 1.0 - fVar228;
  fVar216 = 1.0 - fVar228;
  fVar253 = 1.0 - fVar228;
  fVar265 = 1.0 - fVar228;
  fVar117 = local_388 * fVar214 + local_358 * fVar228;
  fVar145 = fStack_384 * fVar216 + fStack_354 * fVar228;
  fVar146 = fStack_380 * fVar253 + fStack_350 * fVar228;
  fVar189 = fStack_37c * fVar265 + fStack_34c * fVar228;
  fVar359 = local_3a8 * fVar214 + local_3c8 * fVar228;
  fVar287 = fStack_3a4 * fVar216 + fStack_3c4 * fVar228;
  fVar368 = fStack_3a0 * fVar253 + fStack_3c0 * fVar228;
  fVar230 = fStack_39c * fVar265 + fStack_3bc * fVar228;
  fVar267 = fVar359 - fVar117;
  fVar288 = fVar287 - fVar145;
  fVar352 = fVar368 - fVar146;
  fVar231 = fVar230 - fVar189;
  auVar177._4_4_ = fVar264;
  auVar177._0_4_ = fVar264;
  auVar177._8_4_ = fVar264;
  auVar177._12_4_ = fVar264;
  fVar117 = (((fVar117 - (local_378 * fVar214 + local_368 * fVar228)) * fVar229 + fVar264 * fVar267)
             * fVar229 +
            (fVar267 * fVar229 + ((fVar214 * local_398 + fVar228 * local_218) - fVar359) * fVar264)
            * fVar264) * 3.0;
  fVar145 = (((fVar145 - (fStack_374 * fVar216 + fStack_364 * fVar228)) * fVar229 +
             fVar264 * fVar288) * fVar229 +
            (fVar288 * fVar229 + ((fVar216 * fStack_394 + fVar228 * fStack_214) - fVar287) * fVar264
            ) * fVar264) * 3.0;
  fVar146 = (((fVar146 - (fStack_370 * fVar253 + fStack_360 * fVar228)) * fVar229 +
             fVar264 * fVar352) * fVar229 +
            (fVar352 * fVar229 + ((fVar253 * fStack_390 + fVar228 * fStack_210) - fVar368) * fVar264
            ) * fVar264) * 3.0;
  fVar189 = (((fVar189 - (fStack_36c * fVar265 + fStack_35c * fVar228)) * fVar229 +
             fVar264 * fVar231) * fVar229 +
            (fVar231 * fVar229 + ((fVar265 * fStack_38c + fVar228 * fStack_20c) - fVar230) * fVar264
            ) * fVar264) * 3.0;
  pGVar20 = (context->scene->geometries).items[uVar113].ptr;
  if ((pGVar20->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (uVar105 = CONCAT71((int7)((ulong)context->args >> 8),1),
       pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_003b07e8;
    fVar214 = fVar217 * local_198 + fVar218 * local_1a8 + fVar227 * local_1b8 + fVar188 * local_1c8;
    fVar216 = fVar217 * fStack_194 +
              fVar218 * fStack_1a4 + fVar227 * fStack_1b4 + fVar188 * fStack_1c4;
    fVar229 = fVar217 * fStack_190 +
              fVar218 * fStack_1a0 + fVar227 * fStack_1b0 + fVar188 * fStack_1c0;
    fVar217 = fVar217 * fStack_18c +
              fVar218 * fStack_19c + fVar227 * fStack_1ac + fVar188 * fStack_1bc;
    auVar177._0_4_ = fVar216 * fVar117 - fVar145 * fVar214;
    auVar177._4_4_ = fVar229 * fVar145 - fVar146 * fVar216;
    auVar177._8_4_ = fVar214 * fVar146 - fVar117 * fVar229;
    auVar177._12_4_ = fVar217 * fVar189 - fVar189 * fVar217;
    local_1f8 = CONCAT44(auVar177._8_4_,auVar177._4_4_);
    local_1f0 = auVar177._0_4_;
    local_1ec = fVar264;
    fStack_1e8 = fVar228;
    local_1e4 = (int)_local_298;
    local_1e0 = uVar113;
    local_1dc = context->user->instID[0];
    local_1d8 = context->user->instPrimID[0];
    ray->tfar = auVar135._0_4_;
    local_3cc = 0xffffffff;
    local_288.valid = &local_3cc;
    local_288.geometryUserPtr = pGVar20->userPtr;
    local_288.context = context->user;
    local_288.hit = (RTCHitN *)&local_1f8;
    local_288.N = 1;
    local_288.ray = (RTCRayN *)ray;
    if (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_003b079c:
      p_Var106 = context->args->filter;
      if ((p_Var106 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
        auVar192 = (*p_Var106)(&local_288);
        auVar177._0_8_ = auVar192._8_8_;
        auVar135._0_8_ = auVar192._0_8_;
        auVar177._8_8_ = extraout_XMM1_Qb_00;
        auVar135._8_8_ = extraout_XMM0_Qb_00;
        p_Var106 = (RTCFilterFunctionN)local_288.valid;
        if (*local_288.valid == 0) goto LAB_003b07db;
      }
      uVar105 = CONCAT71((int7)((ulong)p_Var106 >> 8),1);
      goto LAB_003b07e8;
    }
    auVar192 = (*pGVar20->occlusionFilterN)(&local_288);
    auVar177._0_8_ = auVar192._8_8_;
    auVar135._0_8_ = auVar192._0_8_;
    auVar177._8_8_ = extraout_XMM1_Qb;
    auVar135._8_8_ = extraout_XMM0_Qb;
    if (*local_288.valid != 0) goto LAB_003b079c;
LAB_003b07db:
    auVar135 = ZEXT416((uint)fVar371);
    ray->tfar = fVar371;
  }
  uVar105 = 0;
LAB_003b07e8:
  bVar111 = bVar111 | (byte)uVar105;
  goto LAB_003af7ed;
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }